

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx512::CurveNiMBIntersectorK<4,16>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
               (Precalculations *pre,RayHitK<16> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  __int_type_conflict _Var9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  float fVar26;
  undefined1 auVar27 [16];
  ulong uVar28;
  undefined8 uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  float fVar69;
  float fVar70;
  int iVar71;
  int iVar72;
  int iVar73;
  int iVar74;
  int iVar75;
  int iVar76;
  int iVar77;
  int iVar78;
  int iVar79;
  int iVar80;
  int iVar81;
  int iVar82;
  int iVar83;
  undefined1 auVar84 [32];
  byte bVar85;
  uint uVar86;
  uint uVar87;
  ulong uVar88;
  long lVar89;
  long lVar90;
  Geometry *pGVar91;
  long lVar92;
  byte bVar93;
  ulong uVar94;
  float fVar95;
  float fVar96;
  float fVar161;
  float fVar163;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  float fVar162;
  float fVar164;
  float fVar166;
  float fVar167;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar118 [16];
  float fVar165;
  float fVar168;
  float fVar169;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  vint4 bi_2;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [64];
  undefined4 uVar183;
  float fVar184;
  undefined8 uVar185;
  vint4 bi_1;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [32];
  float fVar189;
  float fVar190;
  float fVar198;
  vint4 bi;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  vint4 ai;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [64];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [64];
  vint4 ai_1;
  undefined1 auVar223 [16];
  vint4 ai_2;
  undefined1 auVar224 [64];
  undefined1 auVar225 [64];
  float fVar227;
  float fVar228;
  undefined1 auVar226 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [16];
  undefined1 auVar243 [64];
  RTCFilterFunctionNArguments args;
  vint<16> mask;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  RTCFilterFunctionNArguments local_830;
  undefined1 local_800 [16];
  Geometry *local_7f0;
  undefined1 (*local_7e8) [32];
  Precalculations *local_7e0;
  ulong local_7d8;
  LinearSpace3fa *local_7d0;
  ulong local_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 uStack_748;
  undefined4 uStack_744;
  undefined1 local_740 [64];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined4 uStack_6c4;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined4 local_580;
  int local_57c;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [64];
  undefined1 local_340 [64];
  undefined1 local_300 [64];
  RTCHitN local_2c0 [64];
  undefined1 local_280 [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 local_1c0 [64];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined1 local_140 [64];
  undefined1 local_100 [64];
  undefined1 local_c0 [64];
  
  uVar94 = (ulong)(byte)prim[1];
  auVar27 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 4 + 6)));
  auVar106 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 5 + 6)));
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 6 + 6)));
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0xf + 6)));
  lVar92 = uVar94 * 0x25;
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)prim[1] * 0x10 + 6)));
  auVar105 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x11 + 6)));
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1a + 6)));
  auVar108 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1b + 6)));
  auVar109 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 * 0x1c + 6)));
  uVar183 = *(undefined4 *)(prim + lVar92 + 0x12);
  auVar239._4_4_ = uVar183;
  auVar239._0_4_ = uVar183;
  auVar239._8_4_ = uVar183;
  auVar239._12_4_ = uVar183;
  auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           0x10);
  auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x20);
  auVar97 = vsubps_avx512vl(auVar110,*(undefined1 (*) [16])(prim + lVar92 + 6));
  fVar26 = (*(float *)(ray + k * 4 + 0x1c0) - *(float *)(prim + lVar92 + 0x16)) *
           *(float *)(prim + lVar92 + 0x1a);
  auVar110._8_8_ = 0;
  auVar110._0_8_ = *(ulong *)(prim + uVar94 * 7 + 6);
  auVar116 = vpmovsxwd_avx(auVar110);
  auVar113._8_8_ = 0;
  auVar113._0_8_ = *(ulong *)(prim + uVar94 * 0xb + 6);
  auVar242 = vpmovsxwd_avx(auVar113);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar94 * 9 + 6);
  auVar117 = vpmovsxwd_avx(auVar112);
  auVar111._8_8_ = 0;
  auVar111._0_8_ = *(ulong *)(prim + uVar94 * 0xd + 6);
  auVar118 = vpmovsxwd_avx(auVar111);
  auVar98 = vpbroadcastd_avx512vl();
  auVar110 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x140)),0x10);
  auVar110 = vinsertps_avx512f(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x180)),0x20);
  auVar97 = vmulps_avx512vl(auVar239,auVar97);
  auVar99 = vmulps_avx512vl(auVar239,auVar110);
  auVar100 = vcvtdq2ps_avx512vl(auVar27);
  auVar101 = vcvtdq2ps_avx512vl(auVar106);
  auVar102 = vcvtdq2ps_avx512vl(auVar102);
  auVar103 = vcvtdq2ps_avx512vl(auVar103);
  auVar104 = vcvtdq2ps_avx512vl(auVar104);
  auVar110 = vcvtdq2ps_avx(auVar105);
  auVar113 = vcvtdq2ps_avx(auVar107);
  auVar112 = vcvtdq2ps_avx(auVar108);
  auVar111 = vcvtdq2ps_avx(auVar109);
  uVar183 = auVar99._0_4_;
  auVar231._4_4_ = uVar183;
  auVar231._0_4_ = uVar183;
  auVar231._8_4_ = uVar183;
  auVar231._12_4_ = uVar183;
  auVar27 = vshufps_avx(auVar99,auVar99,0x55);
  auVar106 = vshufps_avx(auVar99,auVar99,0xaa);
  auVar105 = vmulps_avx512vl(auVar106,auVar102);
  auVar186._0_4_ = auVar106._0_4_ * auVar110._0_4_;
  auVar186._4_4_ = auVar106._4_4_ * auVar110._4_4_;
  auVar186._8_4_ = auVar106._8_4_ * auVar110._8_4_;
  auVar186._12_4_ = auVar106._12_4_ * auVar110._12_4_;
  auVar99._0_4_ = auVar111._0_4_ * auVar106._0_4_;
  auVar99._4_4_ = auVar111._4_4_ * auVar106._4_4_;
  auVar99._8_4_ = auVar111._8_4_ * auVar106._8_4_;
  auVar99._12_4_ = auVar111._12_4_ * auVar106._12_4_;
  auVar106 = vfmadd231ps_avx512vl(auVar105,auVar27,auVar101);
  auVar105 = vfmadd231ps_avx512vl(auVar186,auVar27,auVar104);
  auVar27 = vfmadd231ps_fma(auVar99,auVar112,auVar27);
  auVar106 = vfmadd231ps_avx512vl(auVar106,auVar231,auVar100);
  auVar105 = vfmadd231ps_avx512vl(auVar105,auVar231,auVar103);
  auVar27 = vfmadd231ps_fma(auVar27,auVar113,auVar231);
  auVar107 = vbroadcastss_avx512vl(auVar97);
  auVar108 = vshufps_avx512vl(auVar97,auVar97,0x55);
  auVar109 = vshufps_avx512vl(auVar97,auVar97,0xaa);
  auVar102 = vmulps_avx512vl(auVar109,auVar102);
  auVar110 = vmulps_avx512vl(auVar109,auVar110);
  auVar111 = vmulps_avx512vl(auVar109,auVar111);
  auVar102 = vfmadd231ps_avx512vl(auVar102,auVar108,auVar101);
  auVar110 = vfmadd231ps_avx512vl(auVar110,auVar108,auVar104);
  auVar112 = vfmadd231ps_avx512vl(auVar111,auVar108,auVar112);
  auVar100 = vfmadd231ps_avx512vl(auVar102,auVar107,auVar100);
  auVar101 = vfmadd231ps_avx512vl(auVar110,auVar107,auVar103);
  auVar99 = vfmadd231ps_fma(auVar112,auVar107,auVar113);
  auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar110);
  auVar113 = vandps_avx512vl(auVar106,auVar110);
  auVar236._8_4_ = 0x219392ef;
  auVar236._0_8_ = 0x219392ef219392ef;
  auVar236._12_4_ = 0x219392ef;
  uVar88 = vcmpps_avx512vl(auVar113,auVar236,1);
  bVar12 = (bool)((byte)uVar88 & 1);
  auVar97._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._0_4_;
  bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar97._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._4_4_;
  bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar97._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._8_4_;
  bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar97._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar106._12_4_;
  auVar113 = vandps_avx512vl(auVar105,auVar110);
  uVar88 = vcmpps_avx512vl(auVar113,auVar236,1);
  bVar12 = (bool)((byte)uVar88 & 1);
  auVar114._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar105._0_4_;
  bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar105._4_4_;
  bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar105._8_4_;
  bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar105._12_4_;
  auVar110 = vandps_avx512vl(auVar27,auVar110);
  uVar88 = vcmpps_avx512vl(auVar110,auVar236,1);
  bVar12 = (bool)((byte)uVar88 & 1);
  auVar115._0_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._0_4_;
  bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
  auVar115._4_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._4_4_;
  bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
  auVar115._8_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._8_4_;
  bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
  auVar115._12_4_ = (uint)bVar12 * 0x219392ef | (uint)!bVar12 * auVar27._12_4_;
  auVar113 = vrcp14ps_avx512vl(auVar97);
  auVar237._8_4_ = 0x3f800000;
  auVar237._0_8_ = 0x3f8000003f800000;
  auVar237._12_4_ = 0x3f800000;
  auVar110 = vfnmadd213ps_fma(auVar97,auVar113,auVar237);
  auVar111 = vfmadd132ps_fma(auVar110,auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar114);
  auVar110 = vfnmadd213ps_fma(auVar114,auVar113,auVar237);
  auVar109 = vfmadd132ps_fma(auVar110,auVar113,auVar113);
  auVar113 = vrcp14ps_avx512vl(auVar115);
  auVar110 = vfnmadd213ps_fma(auVar115,auVar113,auVar237);
  auVar97 = vfmadd132ps_fma(auVar110,auVar113,auVar113);
  auVar207._4_4_ = fVar26;
  auVar207._0_4_ = fVar26;
  auVar207._8_4_ = fVar26;
  auVar207._12_4_ = fVar26;
  auVar110 = vcvtdq2ps_avx(auVar116);
  auVar113 = vcvtdq2ps_avx(auVar242);
  auVar113 = vsubps_avx(auVar113,auVar110);
  auVar116 = vfmadd213ps_fma(auVar113,auVar207,auVar110);
  auVar110 = vcvtdq2ps_avx(auVar117);
  auVar113 = vcvtdq2ps_avx(auVar118);
  auVar113 = vsubps_avx(auVar113,auVar110);
  auVar242 = vfmadd213ps_fma(auVar113,auVar207,auVar110);
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + uVar94 * 0x12 + 6);
  auVar110 = vpmovsxwd_avx(auVar27);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar106._8_8_ = 0;
  auVar106._0_8_ = *(ulong *)(prim + uVar94 * 0x16 + 6);
  auVar113 = vpmovsxwd_avx(auVar106);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar110);
  auVar27 = vfmadd213ps_fma(auVar113,auVar207,auVar110);
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar94 * 0x14 + 6);
  auVar110 = vpmovsxwd_avx(auVar102);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar103._8_8_ = 0;
  auVar103._0_8_ = *(ulong *)(prim + uVar94 * 0x18 + 6);
  auVar113 = vpmovsxwd_avx(auVar103);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar112 = vsubps_avx(auVar113,auVar110);
  auVar104._8_8_ = 0;
  auVar104._0_8_ = *(ulong *)(prim + uVar94 * 0x1d + 6);
  auVar113 = vpmovsxwd_avx(auVar104);
  auVar112 = vfmadd213ps_fma(auVar112,auVar207,auVar110);
  auVar110 = vcvtdq2ps_avx(auVar113);
  auVar105._8_8_ = 0;
  auVar105._0_8_ = *(ulong *)(prim + uVar94 * 0x21 + 6);
  auVar113 = vpmovsxwd_avx(auVar105);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar110);
  auVar106 = vfmadd213ps_fma(auVar113,auVar207,auVar110);
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar94 * 0x1f + 6);
  auVar110 = vpmovsxwd_avx(auVar107);
  auVar110 = vcvtdq2ps_avx(auVar110);
  auVar108._8_8_ = 0;
  auVar108._0_8_ = *(ulong *)(prim + uVar94 * 0x23 + 6);
  auVar113 = vpmovsxwd_avx(auVar108);
  auVar113 = vcvtdq2ps_avx(auVar113);
  auVar113 = vsubps_avx(auVar113,auVar110);
  auVar113 = vfmadd213ps_fma(auVar113,auVar207,auVar110);
  auVar110 = vsubps_avx(auVar116,auVar100);
  auVar208._0_4_ = auVar111._0_4_ * auVar110._0_4_;
  auVar208._4_4_ = auVar111._4_4_ * auVar110._4_4_;
  auVar208._8_4_ = auVar111._8_4_ * auVar110._8_4_;
  auVar208._12_4_ = auVar111._12_4_ * auVar110._12_4_;
  auVar110 = vsubps_avx(auVar242,auVar100);
  auVar191._0_4_ = auVar111._0_4_ * auVar110._0_4_;
  auVar191._4_4_ = auVar111._4_4_ * auVar110._4_4_;
  auVar191._8_4_ = auVar111._8_4_ * auVar110._8_4_;
  auVar191._12_4_ = auVar111._12_4_ * auVar110._12_4_;
  auVar110 = vsubps_avx(auVar27,auVar101);
  auVar223._0_4_ = auVar109._0_4_ * auVar110._0_4_;
  auVar223._4_4_ = auVar109._4_4_ * auVar110._4_4_;
  auVar223._8_4_ = auVar109._8_4_ * auVar110._8_4_;
  auVar223._12_4_ = auVar109._12_4_ * auVar110._12_4_;
  auVar110 = vsubps_avx(auVar112,auVar101);
  auVar100._0_4_ = auVar109._0_4_ * auVar110._0_4_;
  auVar100._4_4_ = auVar109._4_4_ * auVar110._4_4_;
  auVar100._8_4_ = auVar109._8_4_ * auVar110._8_4_;
  auVar100._12_4_ = auVar109._12_4_ * auVar110._12_4_;
  auVar110 = vsubps_avx(auVar106,auVar99);
  auVar101._0_4_ = auVar97._0_4_ * auVar110._0_4_;
  auVar101._4_4_ = auVar97._4_4_ * auVar110._4_4_;
  auVar101._8_4_ = auVar97._8_4_ * auVar110._8_4_;
  auVar101._12_4_ = auVar97._12_4_ * auVar110._12_4_;
  auVar110 = vsubps_avx(auVar113,auVar99);
  auVar118._0_4_ = auVar97._0_4_ * auVar110._0_4_;
  auVar118._4_4_ = auVar97._4_4_ * auVar110._4_4_;
  auVar118._8_4_ = auVar97._8_4_ * auVar110._8_4_;
  auVar118._12_4_ = auVar97._12_4_ * auVar110._12_4_;
  auVar110 = vpminsd_avx(auVar208,auVar191);
  auVar113 = vpminsd_avx(auVar223,auVar100);
  auVar110 = vmaxps_avx(auVar110,auVar113);
  auVar113 = vpminsd_avx(auVar101,auVar118);
  uVar183 = *(undefined4 *)(ray + k * 4 + 0xc0);
  auVar109._4_4_ = uVar183;
  auVar109._0_4_ = uVar183;
  auVar109._8_4_ = uVar183;
  auVar109._12_4_ = uVar183;
  auVar113 = vmaxps_avx512vl(auVar113,auVar109);
  auVar110 = vmaxps_avx(auVar110,auVar113);
  auVar116._8_4_ = 0x3f7ffffa;
  auVar116._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar116._12_4_ = 0x3f7ffffa;
  local_4b0 = vmulps_avx512vl(auVar110,auVar116);
  auVar110 = vpmaxsd_avx(auVar208,auVar191);
  auVar113 = vpmaxsd_avx(auVar223,auVar100);
  auVar110 = vminps_avx(auVar110,auVar113);
  auVar113 = vpmaxsd_avx(auVar101,auVar118);
  uVar183 = *(undefined4 *)(ray + k * 4 + 0x200);
  auVar242._4_4_ = uVar183;
  auVar242._0_4_ = uVar183;
  auVar242._8_4_ = uVar183;
  auVar242._12_4_ = uVar183;
  auVar113 = vminps_avx512vl(auVar113,auVar242);
  auVar110 = vminps_avx(auVar110,auVar113);
  auVar117._8_4_ = 0x3f800003;
  auVar117._0_8_ = 0x3f8000033f800003;
  auVar117._12_4_ = 0x3f800003;
  auVar110 = vmulps_avx512vl(auVar110,auVar117);
  uVar185 = vcmpps_avx512vl(local_4b0,auVar110,2);
  uVar29 = vpcmpgtd_avx512vl(auVar98,_DAT_01f4ad30);
  local_7c8 = CONCAT44((int)(k >> 0x20),(uint)((byte)uVar185 & 0xf & (byte)uVar29));
  local_7d0 = pre->ray_space + k;
  local_7e8 = (undefined1 (*) [32])local_100;
  auVar182 = vpmovm2d_avx512dq((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_380 = vmovdqa64_avx512f(auVar182);
  auVar182 = ZEXT464(0xbf800000);
  local_7e0 = pre;
  do {
    if (local_7c8 == 0) {
      return;
    }
    lVar92 = 0;
    for (uVar88 = local_7c8; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
      lVar92 = lVar92 + 1;
    }
    uVar6 = *(uint *)(prim + 2);
    uVar86 = *(uint *)(prim + lVar92 * 4 + 6);
    local_7d8 = (ulong)uVar86;
    pGVar91 = (context->scene->geometries).items[uVar6].ptr;
    uVar88 = (ulong)*(uint *)(*(long *)&pGVar91->field_0x58 +
                             local_7d8 *
                             pGVar91[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    fVar26 = (pGVar91->time_range).lower;
    fVar26 = pGVar91->fnumTimeSegments *
             ((*(float *)(ray + k * 4 + 0x1c0) - fVar26) / ((pGVar91->time_range).upper - fVar26));
    auVar110 = vroundss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26),9);
    auVar113 = vaddss_avx512f(ZEXT416((uint)pGVar91->fnumTimeSegments),auVar182._0_16_);
    auVar110 = vminss_avx(auVar110,auVar113);
    auVar110 = vmaxss_avx(ZEXT816(0) << 0x20,auVar110);
    fVar26 = fVar26 - auVar110._0_4_;
    _Var9 = pGVar91[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar90 = (long)(int)auVar110._0_4_ * 0x38;
    lVar92 = *(long *)(_Var9 + 0x10 + lVar90);
    lVar89 = *(long *)(_Var9 + 0x38 + lVar90);
    lVar10 = *(long *)(_Var9 + 0x48 + lVar90);
    auVar187._4_4_ = fVar26;
    auVar187._0_4_ = fVar26;
    auVar187._8_4_ = fVar26;
    auVar187._12_4_ = fVar26;
    pfVar3 = (float *)(lVar89 + uVar88 * lVar10);
    auVar233._0_4_ = fVar26 * *pfVar3;
    auVar233._4_4_ = fVar26 * pfVar3[1];
    auVar233._8_4_ = fVar26 * pfVar3[2];
    auVar233._12_4_ = fVar26 * pfVar3[3];
    pfVar3 = (float *)(lVar89 + (uVar88 + 1) * lVar10);
    auVar238._0_4_ = fVar26 * *pfVar3;
    auVar238._4_4_ = fVar26 * pfVar3[1];
    auVar238._8_4_ = fVar26 * pfVar3[2];
    auVar238._12_4_ = fVar26 * pfVar3[3];
    auVar110 = vmulps_avx512vl(auVar187,*(undefined1 (*) [16])(lVar89 + (uVar88 + 2) * lVar10));
    auVar113 = vmulps_avx512vl(auVar187,*(undefined1 (*) [16])(lVar89 + lVar10 * (uVar88 + 3)));
    lVar89 = *(long *)(_Var9 + lVar90);
    fVar26 = 1.0 - fVar26;
    auVar98._4_4_ = fVar26;
    auVar98._0_4_ = fVar26;
    auVar98._8_4_ = fVar26;
    auVar98._12_4_ = fVar26;
    auVar111 = vfmadd231ps_fma(auVar233,auVar98,*(undefined1 (*) [16])(lVar89 + lVar92 * uVar88));
    auVar27 = vfmadd231ps_fma(auVar238,auVar98,
                              *(undefined1 (*) [16])(lVar89 + lVar92 * (uVar88 + 1)));
    auVar108 = vfmadd231ps_avx512vl
                         (auVar110,auVar98,*(undefined1 (*) [16])(lVar89 + lVar92 * (uVar88 + 2)));
    auVar109 = vfmadd231ps_avx512vl
                         (auVar113,auVar98,*(undefined1 (*) [16])(lVar89 + lVar92 * (uVar88 + 3)));
    iVar7 = (int)pGVar91[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar110 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                             0x1c);
    auVar110 = vinsertps_avx(auVar110,ZEXT416(*(uint *)(ray + k * 4 + 0x80)),0x28);
    auVar112 = vsubps_avx(auVar111,auVar110);
    uVar183 = auVar112._0_4_;
    auVar199._4_4_ = uVar183;
    auVar199._0_4_ = uVar183;
    auVar199._8_4_ = uVar183;
    auVar199._12_4_ = uVar183;
    auVar113 = vshufps_avx(auVar112,auVar112,0x55);
    aVar4 = (local_7d0->vx).field_0;
    aVar5 = (local_7d0->vy).field_0;
    auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
    fVar26 = (local_7d0->vz).field_0.m128[0];
    fVar68 = *(float *)((long)&(local_7d0->vz).field_0 + 4);
    fVar69 = *(float *)((long)&(local_7d0->vz).field_0 + 8);
    fVar70 = *(float *)((long)&(local_7d0->vz).field_0 + 0xc);
    auVar226._0_4_ = fVar26 * auVar112._0_4_;
    auVar226._4_4_ = fVar68 * auVar112._4_4_;
    auVar226._8_4_ = fVar69 * auVar112._8_4_;
    auVar226._12_4_ = fVar70 * auVar112._12_4_;
    auVar113 = vfmadd231ps_fma(auVar226,(undefined1  [16])aVar5,auVar113);
    auVar106 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar199);
    auVar112 = vsubps_avx(auVar27,auVar110);
    uVar183 = auVar112._0_4_;
    auVar200._4_4_ = uVar183;
    auVar200._0_4_ = uVar183;
    auVar200._8_4_ = uVar183;
    auVar200._12_4_ = uVar183;
    auVar113 = vshufps_avx(auVar112,auVar112,0x55);
    auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
    auVar229._0_4_ = fVar26 * auVar112._0_4_;
    auVar229._4_4_ = fVar68 * auVar112._4_4_;
    auVar229._8_4_ = fVar69 * auVar112._8_4_;
    auVar229._12_4_ = fVar70 * auVar112._12_4_;
    auVar113 = vfmadd231ps_fma(auVar229,(undefined1  [16])aVar5,auVar113);
    auVar102 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar200);
    auVar112 = vsubps_avx512vl(auVar108,auVar110);
    uVar183 = auVar112._0_4_;
    auVar201._4_4_ = uVar183;
    auVar201._0_4_ = uVar183;
    auVar201._8_4_ = uVar183;
    auVar201._12_4_ = uVar183;
    auVar113 = vshufps_avx(auVar112,auVar112,0x55);
    auVar112 = vshufps_avx(auVar112,auVar112,0xaa);
    auVar232._0_4_ = fVar26 * auVar112._0_4_;
    auVar232._4_4_ = fVar68 * auVar112._4_4_;
    auVar232._8_4_ = fVar69 * auVar112._8_4_;
    auVar232._12_4_ = fVar70 * auVar112._12_4_;
    auVar113 = vfmadd231ps_fma(auVar232,(undefined1  [16])aVar5,auVar113);
    auVar112 = vfmadd231ps_fma(auVar113,(undefined1  [16])aVar4,auVar201);
    auVar113 = vsubps_avx512vl(auVar109,auVar110);
    uVar183 = auVar113._0_4_;
    auVar202._4_4_ = uVar183;
    auVar202._0_4_ = uVar183;
    auVar202._8_4_ = uVar183;
    auVar202._12_4_ = uVar183;
    auVar110 = vshufps_avx(auVar113,auVar113,0x55);
    auVar113 = vshufps_avx(auVar113,auVar113,0xaa);
    auVar235._0_4_ = fVar26 * auVar113._0_4_;
    auVar235._4_4_ = fVar68 * auVar113._4_4_;
    auVar235._8_4_ = fVar69 * auVar113._8_4_;
    auVar235._12_4_ = fVar70 * auVar113._12_4_;
    auVar110 = vfmadd231ps_fma(auVar235,(undefined1  [16])aVar5,auVar110);
    lVar92 = (long)iVar7 * 0x44;
    auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar92);
    auVar103 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar202);
    uVar183 = auVar106._0_4_;
    local_600._4_4_ = uVar183;
    local_600._0_4_ = uVar183;
    local_600._8_4_ = uVar183;
    local_600._12_4_ = uVar183;
    local_600._16_4_ = uVar183;
    local_600._20_4_ = uVar183;
    local_600._24_4_ = uVar183;
    local_600._28_4_ = uVar183;
    auVar119._8_4_ = 1;
    auVar119._0_8_ = 0x100000001;
    auVar119._12_4_ = 1;
    auVar119._16_4_ = 1;
    auVar119._20_4_ = 1;
    auVar119._24_4_ = 1;
    auVar119._28_4_ = 1;
    local_620 = vpermps_avx2(auVar119,ZEXT1632(auVar106));
    auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0x484);
    uVar183 = auVar102._0_4_;
    auVar203._4_4_ = uVar183;
    auVar203._0_4_ = uVar183;
    auVar203._8_4_ = uVar183;
    auVar203._12_4_ = uVar183;
    local_640._16_4_ = uVar183;
    local_640._0_16_ = auVar203;
    local_640._20_4_ = uVar183;
    local_640._24_4_ = uVar183;
    local_640._28_4_ = uVar183;
    local_660 = vpermps_avx512vl(auVar119,ZEXT1632(auVar102));
    auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0x908);
    local_680 = vbroadcastss_avx512vl(auVar112);
    auVar131 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0xd8c);
    local_6a0 = vpermps_avx512vl(auVar119,ZEXT1632(auVar112));
    uVar183 = auVar103._0_4_;
    local_6c0._4_4_ = uVar183;
    local_6c0._0_4_ = uVar183;
    fStack_6b8 = (float)uVar183;
    fStack_6b4 = (float)uVar183;
    fStack_6b0 = (float)uVar183;
    fStack_6ac = (float)uVar183;
    fStack_6a8 = (float)uVar183;
    register0x0000139c = uVar183;
    _local_6e0 = vpermps_avx512vl(auVar119,ZEXT1632(auVar103));
    auVar119 = vmulps_avx512vl(_local_6c0,auVar131);
    auVar120 = vmulps_avx512vl(_local_6e0,auVar131);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar132,local_680);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar132,local_6a0);
    auVar110 = vfmadd231ps_fma(auVar119,auVar134,local_640);
    auVar121 = vfmadd231ps_avx512vl(auVar120,auVar134,local_660);
    auVar122 = vfmadd231ps_avx512vl(ZEXT1632(auVar110),auVar133,local_600);
    auVar222 = ZEXT3264(auVar122);
    auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar92);
    auVar120 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0x484);
    auVar130 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0x908);
    auVar129 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0xd8c);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar133,local_620);
    auVar219 = ZEXT3264(auVar121);
    auVar123 = vmulps_avx512vl(_local_6c0,auVar129);
    auVar124 = vmulps_avx512vl(_local_6e0,auVar129);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar130,local_680);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar130,local_6a0);
    auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,local_640);
    auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,local_660);
    auVar104 = vfmadd231ps_fma(auVar123,auVar119,local_600);
    auVar224 = ZEXT1664(auVar104);
    auVar105 = vfmadd231ps_fma(auVar124,auVar119,local_620);
    auVar123 = vsubps_avx512vl(ZEXT1632(auVar104),auVar122);
    auVar124 = vsubps_avx512vl(ZEXT1632(auVar105),auVar121);
    auVar125 = vmulps_avx512vl(auVar121,auVar123);
    auVar126 = vmulps_avx512vl(auVar122,auVar124);
    auVar125 = vsubps_avx512vl(auVar125,auVar126);
    auVar110 = vshufps_avx(auVar111,auVar111,0xff);
    uVar185 = auVar110._0_8_;
    local_3a0._8_8_ = uVar185;
    local_3a0._0_8_ = uVar185;
    local_3a0._16_8_ = uVar185;
    local_3a0._24_8_ = uVar185;
    auVar110 = vshufps_avx(auVar27,auVar27,0xff);
    local_3c0 = vbroadcastsd_avx512vl(auVar110);
    auVar110 = vshufps_avx512vl(auVar108,auVar108,0xff);
    local_3e0 = vbroadcastsd_avx512vl(auVar110);
    auVar110 = vshufps_avx512vl(auVar109,auVar109,0xff);
    uVar185 = auVar110._0_8_;
    local_400._8_8_ = uVar185;
    local_400._0_8_ = uVar185;
    local_400._16_8_ = uVar185;
    local_400._24_8_ = uVar185;
    auVar126 = vmulps_avx512vl(local_400,auVar131);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar132,local_3e0);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar134,local_3c0);
    auVar126 = vfmadd231ps_avx512vl(auVar126,auVar133,local_3a0);
    auVar127 = vmulps_avx512vl(local_400,auVar129);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar130,local_3e0);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar120,local_3c0);
    auVar107 = vfmadd231ps_fma(auVar127,auVar119,local_3a0);
    auVar127 = vmulps_avx512vl(auVar124,auVar124);
    auVar127 = vfmadd231ps_avx512vl(auVar127,auVar123,auVar123);
    auVar128 = vmaxps_avx512vl(auVar126,ZEXT1632(auVar107));
    auVar128 = vmulps_avx512vl(auVar128,auVar128);
    auVar127 = vmulps_avx512vl(auVar128,auVar127);
    auVar125 = vmulps_avx512vl(auVar125,auVar125);
    uVar185 = vcmpps_avx512vl(auVar125,auVar127,2);
    auVar110 = vblendps_avx(auVar106,auVar111,8);
    auVar242 = auVar243._0_16_;
    auVar113 = vandps_avx512vl(auVar110,auVar242);
    auVar110 = vblendps_avx(auVar102,auVar27,8);
    auVar110 = vandps_avx512vl(auVar110,auVar242);
    auVar113 = vmaxps_avx(auVar113,auVar110);
    auVar110 = vblendps_avx(auVar112,auVar108,8);
    auVar116 = vandps_avx512vl(auVar110,auVar242);
    auVar110 = vblendps_avx(auVar103,auVar109,8);
    auVar110 = vandps_avx512vl(auVar110,auVar242);
    auVar110 = vmaxps_avx(auVar116,auVar110);
    auVar110 = vmaxps_avx(auVar113,auVar110);
    auVar113 = vmovshdup_avx(auVar110);
    auVar113 = vmaxss_avx(auVar113,auVar110);
    auVar110 = vshufpd_avx(auVar110,auVar110,1);
    auVar110 = vmaxss_avx(auVar110,auVar113);
    auVar113 = vcvtsi2ss_avx512f(auVar242,iVar7);
    local_7c0._0_16_ = auVar113;
    auVar127._0_4_ = auVar113._0_4_;
    auVar127._4_4_ = auVar127._0_4_;
    auVar127._8_4_ = auVar127._0_4_;
    auVar127._12_4_ = auVar127._0_4_;
    auVar127._16_4_ = auVar127._0_4_;
    auVar127._20_4_ = auVar127._0_4_;
    auVar127._24_4_ = auVar127._0_4_;
    auVar127._28_4_ = auVar127._0_4_;
    uVar29 = vcmpps_avx512vl(auVar127,_DAT_01f7b060,0xe);
    bVar93 = (byte)uVar185 & (byte)uVar29;
    local_800 = vmulss_avx512f(auVar110,SUB6416(ZEXT464(0x35000000),0));
    auVar125._8_4_ = 2;
    auVar125._0_8_ = 0x200000002;
    auVar125._12_4_ = 2;
    auVar125._16_4_ = 2;
    auVar125._20_4_ = 2;
    auVar125._24_4_ = 2;
    auVar125._28_4_ = 2;
    local_440 = vpermps_avx2(auVar125,ZEXT1632(auVar106));
    local_460 = vpermps_avx2(auVar125,ZEXT1632(auVar102));
    local_480 = vpermps_avx2(auVar125,ZEXT1632(auVar112));
    local_4a0 = vpermps_avx2(auVar125,ZEXT1632(auVar103));
    local_760 = *(undefined4 *)(ray + k * 4 + 0xc0);
    uStack_75c = 0;
    uStack_758 = 0;
    uStack_754 = 0;
    auVar159 = vpbroadcastd_avx512f();
    local_300 = vmovdqa64_avx512f(auVar159);
    auVar159 = vpbroadcastd_avx512f();
    local_340 = vmovdqa64_avx512f(auVar159);
    local_840 = auVar111._0_8_;
    uStack_838 = auVar111._8_8_;
    local_850 = auVar27._0_8_;
    uStack_848 = auVar27._8_8_;
    local_860 = auVar108._0_8_;
    uStack_858 = auVar108._8_8_;
    local_870._0_4_ = auVar109._0_4_;
    fVar26 = (float)local_870;
    local_870._4_4_ = auVar109._4_4_;
    fVar68 = local_870._4_4_;
    uStack_868._0_4_ = auVar109._8_4_;
    fVar69 = (float)uStack_868;
    uStack_868._4_4_ = auVar109._12_4_;
    fVar70 = uStack_868._4_4_;
    local_870 = auVar109._0_8_;
    uStack_868 = auVar109._8_8_;
    if (bVar93 != 0) {
      auVar129 = vmulps_avx512vl(local_4a0,auVar129);
      auVar130 = vfmadd213ps_avx512vl(auVar130,local_480,auVar129);
      auVar120 = vfmadd213ps_avx512vl(auVar120,local_460,auVar130);
      auVar129 = vfmadd213ps_avx512vl(auVar119,local_440,auVar120);
      auVar131 = vmulps_avx512vl(local_4a0,auVar131);
      auVar132 = vfmadd213ps_avx512vl(auVar132,local_480,auVar131);
      auVar120 = vfmadd213ps_avx512vl(auVar134,local_460,auVar132);
      auVar134 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0x1210);
      auVar132 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0x1694);
      auVar131 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0x1b18);
      auVar119 = *(undefined1 (*) [32])(bspline_basis0 + lVar92 + 0x1f9c);
      auVar125 = vfmadd213ps_avx512vl(auVar133,local_440,auVar120);
      auVar133 = vmulps_avx512vl(_local_6c0,auVar119);
      auVar120 = vmulps_avx512vl(_local_6e0,auVar119);
      auVar119 = vmulps_avx512vl(local_4a0,auVar119);
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar131,local_680);
      auVar120 = vfmadd231ps_avx512vl(auVar120,auVar131,local_6a0);
      auVar131 = vfmadd231ps_avx512vl(auVar119,local_480,auVar131);
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar132,local_640);
      auVar119 = vfmadd231ps_avx512vl(auVar120,auVar132,local_660);
      auVar120 = vfmadd231ps_avx512vl(auVar131,local_460,auVar132);
      auVar110 = vfmadd231ps_fma(auVar133,auVar134,local_600);
      auVar119 = vfmadd231ps_avx512vl(auVar119,auVar134,local_620);
      auVar133 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0x1210);
      auVar132 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0x1b18);
      auVar131 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0x1f9c);
      auVar120 = vfmadd231ps_avx512vl(auVar120,local_440,auVar134);
      auVar134 = vmulps_avx512vl(_local_6c0,auVar131);
      auVar130 = vmulps_avx512vl(_local_6e0,auVar131);
      auVar131 = vmulps_avx512vl(local_4a0,auVar131);
      auVar128 = vfmadd231ps_avx512vl(auVar134,auVar132,local_680);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar132,local_6a0);
      auVar132 = vfmadd231ps_avx512vl(auVar131,local_480,auVar132);
      auVar243 = ZEXT1664(auVar242);
      auVar134 = *(undefined1 (*) [32])(bspline_basis1 + lVar92 + 0x1694);
      auVar131 = vfmadd231ps_avx512vl(auVar128,auVar134,local_640);
      auVar130 = vfmadd231ps_avx512vl(auVar130,auVar134,local_660);
      auVar134 = vfmadd231ps_avx512vl(auVar132,local_460,auVar134);
      auVar182 = ZEXT1664(auVar182._0_16_);
      auVar113 = vfmadd231ps_fma(auVar131,auVar133,local_600);
      auVar132 = vfmadd231ps_avx512vl(auVar130,auVar133,local_620);
      auVar131 = vfmadd231ps_avx512vl(auVar134,local_440,auVar133);
      auVar240._8_4_ = 0x7fffffff;
      auVar240._0_8_ = 0x7fffffff7fffffff;
      auVar240._12_4_ = 0x7fffffff;
      auVar240._16_4_ = 0x7fffffff;
      auVar240._20_4_ = 0x7fffffff;
      auVar240._24_4_ = 0x7fffffff;
      auVar240._28_4_ = 0x7fffffff;
      auVar133 = vandps_avx(ZEXT1632(auVar110),auVar240);
      auVar134 = vandps_avx(auVar119,auVar240);
      auVar134 = vmaxps_avx(auVar133,auVar134);
      auVar133 = vandps_avx(auVar120,auVar240);
      auVar133 = vmaxps_avx(auVar134,auVar133);
      auVar234._4_4_ = local_800._0_4_;
      auVar234._0_4_ = local_800._0_4_;
      auVar234._8_4_ = local_800._0_4_;
      auVar234._12_4_ = local_800._0_4_;
      auVar234._16_4_ = local_800._0_4_;
      auVar234._20_4_ = local_800._0_4_;
      auVar234._24_4_ = local_800._0_4_;
      auVar234._28_4_ = local_800._0_4_;
      uVar88 = vcmpps_avx512vl(auVar133,auVar234,1);
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar128._0_4_ = (float)((uint)bVar12 * auVar123._0_4_ | (uint)!bVar12 * auVar110._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar128._4_4_ = (float)((uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * auVar110._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar128._8_4_ = (float)((uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * auVar110._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar128._12_4_ = (float)((uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * auVar110._12_4_);
      fVar227 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar123._16_4_);
      auVar128._16_4_ = fVar227;
      fVar190 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar123._20_4_);
      auVar128._20_4_ = fVar190;
      fVar228 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar123._24_4_);
      auVar128._24_4_ = fVar228;
      uVar87 = (uint)(byte)(uVar88 >> 7) * auVar123._28_4_;
      auVar128._28_4_ = uVar87;
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar135._0_4_ = (float)((uint)bVar12 * auVar124._0_4_ | (uint)!bVar12 * auVar119._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar135._4_4_ = (float)((uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * auVar119._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar135._8_4_ = (float)((uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * auVar119._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar135._12_4_ = (float)((uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * auVar119._12_4_);
      bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar135._16_4_ = (float)((uint)bVar12 * auVar124._16_4_ | (uint)!bVar12 * auVar119._16_4_);
      bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar135._20_4_ = (float)((uint)bVar12 * auVar124._20_4_ | (uint)!bVar12 * auVar119._20_4_);
      bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar135._24_4_ = (float)((uint)bVar12 * auVar124._24_4_ | (uint)!bVar12 * auVar119._24_4_);
      bVar12 = SUB81(uVar88 >> 7,0);
      auVar135._28_4_ = (uint)bVar12 * auVar124._28_4_ | (uint)!bVar12 * auVar119._28_4_;
      auVar133 = vandps_avx(auVar240,ZEXT1632(auVar113));
      auVar134 = vandps_avx(auVar132,auVar240);
      auVar134 = vmaxps_avx(auVar133,auVar134);
      auVar133 = vandps_avx(auVar131,auVar240);
      auVar133 = vmaxps_avx(auVar134,auVar133);
      uVar88 = vcmpps_avx512vl(auVar133,auVar234,1);
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar136._0_4_ = (float)((uint)bVar12 * auVar123._0_4_ | (uint)!bVar12 * auVar113._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar136._4_4_ = (float)((uint)bVar12 * auVar123._4_4_ | (uint)!bVar12 * auVar113._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar136._8_4_ = (float)((uint)bVar12 * auVar123._8_4_ | (uint)!bVar12 * auVar113._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar136._12_4_ = (float)((uint)bVar12 * auVar123._12_4_ | (uint)!bVar12 * auVar113._12_4_);
      fVar184 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar123._16_4_);
      auVar136._16_4_ = fVar184;
      fVar189 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar123._20_4_);
      auVar136._20_4_ = fVar189;
      fVar198 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar123._24_4_);
      auVar136._24_4_ = fVar198;
      auVar136._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar123._28_4_;
      bVar12 = (bool)((byte)uVar88 & 1);
      auVar137._0_4_ = (float)((uint)bVar12 * auVar124._0_4_ | (uint)!bVar12 * auVar132._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar137._4_4_ = (float)((uint)bVar12 * auVar124._4_4_ | (uint)!bVar12 * auVar132._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar137._8_4_ = (float)((uint)bVar12 * auVar124._8_4_ | (uint)!bVar12 * auVar132._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar137._12_4_ = (float)((uint)bVar12 * auVar124._12_4_ | (uint)!bVar12 * auVar132._12_4_);
      bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar137._16_4_ = (float)((uint)bVar12 * auVar124._16_4_ | (uint)!bVar12 * auVar132._16_4_);
      bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar137._20_4_ = (float)((uint)bVar12 * auVar124._20_4_ | (uint)!bVar12 * auVar132._20_4_);
      bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar137._24_4_ = (float)((uint)bVar12 * auVar124._24_4_ | (uint)!bVar12 * auVar132._24_4_);
      bVar12 = SUB81(uVar88 >> 7,0);
      auVar137._28_4_ = (uint)bVar12 * auVar124._28_4_ | (uint)!bVar12 * auVar132._28_4_;
      auVar117 = vxorps_avx512vl(auVar203,auVar203);
      auVar133 = vfmadd213ps_avx512vl(auVar128,auVar128,ZEXT1632(auVar117));
      auVar110 = vfmadd231ps_fma(auVar133,auVar135,auVar135);
      auVar132 = vrsqrt14ps_avx512vl(ZEXT1632(auVar110));
      fVar95 = auVar132._0_4_;
      fVar96 = auVar132._4_4_;
      fVar161 = auVar132._8_4_;
      fVar162 = auVar132._12_4_;
      fVar163 = auVar132._16_4_;
      fVar164 = auVar132._20_4_;
      fVar166 = auVar132._24_4_;
      auVar133._4_4_ = fVar96 * fVar96 * fVar96 * auVar110._4_4_ * -0.5;
      auVar133._0_4_ = fVar95 * fVar95 * fVar95 * auVar110._0_4_ * -0.5;
      auVar133._8_4_ = fVar161 * fVar161 * fVar161 * auVar110._8_4_ * -0.5;
      auVar133._12_4_ = fVar162 * fVar162 * fVar162 * auVar110._12_4_ * -0.5;
      auVar133._16_4_ = fVar163 * fVar163 * fVar163 * -0.0;
      auVar133._20_4_ = fVar164 * fVar164 * fVar164 * -0.0;
      auVar133._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
      auVar133._28_4_ = 0;
      auVar119 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar119,auVar132);
      auVar134._4_4_ = auVar135._4_4_ * auVar133._4_4_;
      auVar134._0_4_ = auVar135._0_4_ * auVar133._0_4_;
      auVar134._8_4_ = auVar135._8_4_ * auVar133._8_4_;
      auVar134._12_4_ = auVar135._12_4_ * auVar133._12_4_;
      auVar134._16_4_ = auVar135._16_4_ * auVar133._16_4_;
      auVar134._20_4_ = auVar135._20_4_ * auVar133._20_4_;
      auVar134._24_4_ = auVar135._24_4_ * auVar133._24_4_;
      auVar134._28_4_ = auVar132._28_4_;
      auVar132._4_4_ = auVar133._4_4_ * -auVar128._4_4_;
      auVar132._0_4_ = auVar133._0_4_ * -auVar128._0_4_;
      auVar132._8_4_ = auVar133._8_4_ * -auVar128._8_4_;
      auVar132._12_4_ = auVar133._12_4_ * -auVar128._12_4_;
      auVar132._16_4_ = auVar133._16_4_ * -fVar227;
      auVar132._20_4_ = auVar133._20_4_ * -fVar190;
      auVar132._24_4_ = auVar133._24_4_ * -fVar228;
      auVar132._28_4_ = uVar87 ^ 0x80000000;
      auVar123 = vmulps_avx512vl(auVar133,ZEXT1632(auVar117));
      auVar124 = ZEXT1632(auVar117);
      auVar131 = vfmadd213ps_avx512vl(auVar136,auVar136,auVar124);
      auVar110 = vfmadd231ps_fma(auVar131,auVar137,auVar137);
      auVar130 = vrsqrt14ps_avx512vl(ZEXT1632(auVar110));
      fVar190 = auVar130._0_4_;
      fVar227 = auVar130._4_4_;
      fVar228 = auVar130._8_4_;
      fVar95 = auVar130._12_4_;
      fVar96 = auVar130._16_4_;
      fVar161 = auVar130._20_4_;
      fVar162 = auVar130._24_4_;
      auVar131._4_4_ = fVar227 * fVar227 * fVar227 * auVar110._4_4_ * -0.5;
      auVar131._0_4_ = fVar190 * fVar190 * fVar190 * auVar110._0_4_ * -0.5;
      auVar131._8_4_ = fVar228 * fVar228 * fVar228 * auVar110._8_4_ * -0.5;
      auVar131._12_4_ = fVar95 * fVar95 * fVar95 * auVar110._12_4_ * -0.5;
      auVar131._16_4_ = fVar96 * fVar96 * fVar96 * -0.0;
      auVar131._20_4_ = fVar161 * fVar161 * fVar161 * -0.0;
      auVar131._24_4_ = fVar162 * fVar162 * fVar162 * -0.0;
      auVar131._28_4_ = 0;
      auVar131 = vfmadd231ps_avx512vl(auVar131,auVar119,auVar130);
      auVar120._4_4_ = auVar137._4_4_ * auVar131._4_4_;
      auVar120._0_4_ = auVar137._0_4_ * auVar131._0_4_;
      auVar120._8_4_ = auVar137._8_4_ * auVar131._8_4_;
      auVar120._12_4_ = auVar137._12_4_ * auVar131._12_4_;
      auVar120._16_4_ = auVar137._16_4_ * auVar131._16_4_;
      auVar120._20_4_ = auVar137._20_4_ * auVar131._20_4_;
      auVar120._24_4_ = auVar137._24_4_ * auVar131._24_4_;
      auVar120._28_4_ = auVar130._28_4_;
      auVar130._4_4_ = -auVar136._4_4_ * auVar131._4_4_;
      auVar130._0_4_ = -auVar136._0_4_ * auVar131._0_4_;
      auVar130._8_4_ = -auVar136._8_4_ * auVar131._8_4_;
      auVar130._12_4_ = -auVar136._12_4_ * auVar131._12_4_;
      auVar130._16_4_ = -fVar184 * auVar131._16_4_;
      auVar130._20_4_ = -fVar189 * auVar131._20_4_;
      auVar130._24_4_ = -fVar198 * auVar131._24_4_;
      auVar130._28_4_ = auVar133._28_4_;
      auVar133 = vmulps_avx512vl(auVar131,auVar124);
      auVar110 = vfmadd213ps_fma(auVar134,auVar126,auVar122);
      auVar113 = vfmadd213ps_fma(auVar132,auVar126,auVar121);
      auVar131 = vfmadd213ps_avx512vl(auVar123,auVar126,auVar125);
      auVar119 = vfmadd213ps_avx512vl(auVar120,ZEXT1632(auVar107),ZEXT1632(auVar104));
      auVar109 = vfnmadd213ps_fma(auVar134,auVar126,auVar122);
      auVar122 = ZEXT1632(auVar107);
      auVar112 = vfmadd213ps_fma(auVar130,auVar122,ZEXT1632(auVar105));
      auVar116 = vfnmadd213ps_fma(auVar132,auVar126,auVar121);
      auVar106 = vfmadd213ps_fma(auVar133,auVar122,auVar129);
      auVar134 = vfnmadd231ps_avx512vl(auVar125,auVar126,auVar123);
      auVar104 = vfnmadd213ps_fma(auVar120,auVar122,ZEXT1632(auVar104));
      auVar105 = vfnmadd213ps_fma(auVar130,auVar122,ZEXT1632(auVar105));
      auVar242 = vfnmadd231ps_fma(auVar129,ZEXT1632(auVar107),auVar133);
      auVar132 = vsubps_avx512vl(auVar119,ZEXT1632(auVar109));
      auVar133 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar116));
      auVar120 = vsubps_avx512vl(ZEXT1632(auVar106),auVar134);
      auVar130 = vmulps_avx512vl(auVar133,auVar134);
      auVar102 = vfmsub231ps_fma(auVar130,ZEXT1632(auVar116),auVar120);
      auVar129._4_4_ = auVar109._4_4_ * auVar120._4_4_;
      auVar129._0_4_ = auVar109._0_4_ * auVar120._0_4_;
      auVar129._8_4_ = auVar109._8_4_ * auVar120._8_4_;
      auVar129._12_4_ = auVar109._12_4_ * auVar120._12_4_;
      auVar129._16_4_ = auVar120._16_4_ * 0.0;
      auVar129._20_4_ = auVar120._20_4_ * 0.0;
      auVar129._24_4_ = auVar120._24_4_ * 0.0;
      auVar129._28_4_ = auVar120._28_4_;
      auVar120 = vfmsub231ps_avx512vl(auVar129,auVar134,auVar132);
      auVar121._4_4_ = auVar116._4_4_ * auVar132._4_4_;
      auVar121._0_4_ = auVar116._0_4_ * auVar132._0_4_;
      auVar121._8_4_ = auVar116._8_4_ * auVar132._8_4_;
      auVar121._12_4_ = auVar116._12_4_ * auVar132._12_4_;
      auVar121._16_4_ = auVar132._16_4_ * 0.0;
      auVar121._20_4_ = auVar132._20_4_ * 0.0;
      auVar121._24_4_ = auVar132._24_4_ * 0.0;
      auVar121._28_4_ = auVar132._28_4_;
      auVar103 = vfmsub231ps_fma(auVar121,ZEXT1632(auVar109),auVar133);
      auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar103),auVar124,auVar120);
      auVar133 = vfmadd231ps_avx512vl(auVar133,auVar124,ZEXT1632(auVar102));
      auVar125 = ZEXT1632(auVar117);
      uVar88 = vcmpps_avx512vl(auVar133,auVar125,2);
      bVar85 = (byte)uVar88;
      fVar95 = (float)((uint)(bVar85 & 1) * auVar110._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar104._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      fVar161 = (float)((uint)bVar12 * auVar110._4_4_ | (uint)!bVar12 * auVar104._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      fVar163 = (float)((uint)bVar12 * auVar110._8_4_ | (uint)!bVar12 * auVar104._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      fVar166 = (float)((uint)bVar12 * auVar110._12_4_ | (uint)!bVar12 * auVar104._12_4_);
      auVar130 = ZEXT1632(CONCAT412(fVar166,CONCAT48(fVar163,CONCAT44(fVar161,fVar95))));
      fVar96 = (float)((uint)(bVar85 & 1) * auVar113._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar105._0_4_);
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      fVar162 = (float)((uint)bVar12 * auVar113._4_4_ | (uint)!bVar12 * auVar105._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      fVar164 = (float)((uint)bVar12 * auVar113._8_4_ | (uint)!bVar12 * auVar105._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      fVar167 = (float)((uint)bVar12 * auVar113._12_4_ | (uint)!bVar12 * auVar105._12_4_);
      auVar129 = ZEXT1632(CONCAT412(fVar167,CONCAT48(fVar164,CONCAT44(fVar162,fVar96))));
      auVar138._0_4_ =
           (float)((uint)(bVar85 & 1) * auVar131._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar242._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar138._4_4_ = (float)((uint)bVar12 * auVar131._4_4_ | (uint)!bVar12 * auVar242._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar138._8_4_ = (float)((uint)bVar12 * auVar131._8_4_ | (uint)!bVar12 * auVar242._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar138._12_4_ = (float)((uint)bVar12 * auVar131._12_4_ | (uint)!bVar12 * auVar242._12_4_);
      fVar228 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar131._16_4_);
      auVar138._16_4_ = fVar228;
      fVar227 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar131._20_4_);
      auVar138._20_4_ = fVar227;
      fVar190 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar131._24_4_);
      auVar138._24_4_ = fVar190;
      iVar1 = (uint)(byte)(uVar88 >> 7) * auVar131._28_4_;
      auVar138._28_4_ = iVar1;
      auVar132 = vblendmps_avx512vl(ZEXT1632(auVar109),auVar119);
      auVar139._0_4_ =
           (uint)(bVar85 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar113._0_4_;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar139._4_4_ = (uint)bVar12 * auVar132._4_4_ | (uint)!bVar12 * auVar113._4_4_;
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar139._8_4_ = (uint)bVar12 * auVar132._8_4_ | (uint)!bVar12 * auVar113._8_4_;
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar139._12_4_ = (uint)bVar12 * auVar132._12_4_ | (uint)!bVar12 * auVar113._12_4_;
      auVar139._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar132._16_4_;
      auVar139._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar132._20_4_;
      auVar139._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar132._24_4_;
      auVar139._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar132._28_4_;
      auVar132 = vblendmps_avx512vl(ZEXT1632(auVar116),ZEXT1632(auVar112));
      auVar140._0_4_ =
           (float)((uint)(bVar85 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar102._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar140._4_4_ = (float)((uint)bVar12 * auVar132._4_4_ | (uint)!bVar12 * auVar102._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar140._8_4_ = (float)((uint)bVar12 * auVar132._8_4_ | (uint)!bVar12 * auVar102._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar140._12_4_ = (float)((uint)bVar12 * auVar132._12_4_ | (uint)!bVar12 * auVar102._12_4_);
      fVar184 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar132._16_4_);
      auVar140._16_4_ = fVar184;
      fVar198 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar132._20_4_);
      auVar140._20_4_ = fVar198;
      fVar189 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar132._24_4_);
      auVar140._24_4_ = fVar189;
      auVar140._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar132._28_4_;
      auVar132 = vblendmps_avx512vl(auVar134,ZEXT1632(auVar106));
      auVar141._0_4_ =
           (float)((uint)(bVar85 & 1) * auVar132._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar131._0_4_)
      ;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar141._4_4_ = (float)((uint)bVar12 * auVar132._4_4_ | (uint)!bVar12 * auVar131._4_4_);
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar141._8_4_ = (float)((uint)bVar12 * auVar132._8_4_ | (uint)!bVar12 * auVar131._8_4_);
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar141._12_4_ = (float)((uint)bVar12 * auVar132._12_4_ | (uint)!bVar12 * auVar131._12_4_);
      bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
      auVar141._16_4_ = (float)((uint)bVar12 * auVar132._16_4_ | (uint)!bVar12 * auVar131._16_4_);
      bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
      auVar141._20_4_ = (float)((uint)bVar12 * auVar132._20_4_ | (uint)!bVar12 * auVar131._20_4_);
      bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
      auVar141._24_4_ = (float)((uint)bVar12 * auVar132._24_4_ | (uint)!bVar12 * auVar131._24_4_);
      bVar12 = SUB81(uVar88 >> 7,0);
      auVar141._28_4_ = (uint)bVar12 * auVar132._28_4_ | (uint)!bVar12 * auVar131._28_4_;
      auVar142._0_4_ =
           (uint)(bVar85 & 1) * (int)auVar109._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar119._0_4_;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar142._4_4_ = (uint)bVar12 * (int)auVar109._4_4_ | (uint)!bVar12 * auVar119._4_4_;
      bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar142._8_4_ = (uint)bVar12 * (int)auVar109._8_4_ | (uint)!bVar12 * auVar119._8_4_;
      bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar142._12_4_ = (uint)bVar12 * (int)auVar109._12_4_ | (uint)!bVar12 * auVar119._12_4_;
      auVar142._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar119._16_4_;
      auVar142._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar119._20_4_;
      auVar142._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar119._24_4_;
      auVar142._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar119._28_4_;
      bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
      bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
      bVar15 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar143._0_4_ =
           (uint)(bVar85 & 1) * auVar134._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar106._0_4_;
      bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
      auVar143._4_4_ = (uint)bVar13 * auVar134._4_4_ | (uint)!bVar13 * auVar106._4_4_;
      bVar13 = (bool)((byte)(uVar88 >> 2) & 1);
      auVar143._8_4_ = (uint)bVar13 * auVar134._8_4_ | (uint)!bVar13 * auVar106._8_4_;
      bVar13 = (bool)((byte)(uVar88 >> 3) & 1);
      auVar143._12_4_ = (uint)bVar13 * auVar134._12_4_ | (uint)!bVar13 * auVar106._12_4_;
      auVar143._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar134._16_4_;
      auVar143._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar134._20_4_;
      auVar143._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar134._24_4_;
      iVar2 = (uint)(byte)(uVar88 >> 7) * auVar134._28_4_;
      auVar143._28_4_ = iVar2;
      auVar121 = vsubps_avx512vl(auVar142,auVar130);
      auVar134 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar15 * (int)auVar116._12_4_ |
                                               (uint)!bVar15 * auVar112._12_4_,
                                               CONCAT48((uint)bVar14 * (int)auVar116._8_4_ |
                                                        (uint)!bVar14 * auVar112._8_4_,
                                                        CONCAT44((uint)bVar12 * (int)auVar116._4_4_
                                                                 | (uint)!bVar12 * auVar112._4_4_,
                                                                 (uint)(bVar85 & 1) *
                                                                 (int)auVar116._0_4_ |
                                                                 (uint)!(bool)(bVar85 & 1) *
                                                                 auVar112._0_4_)))),auVar129);
      auVar222 = ZEXT3264(auVar134);
      auVar132 = vsubps_avx(auVar143,auVar138);
      auVar131 = vsubps_avx(auVar130,auVar139);
      auVar224 = ZEXT3264(auVar131);
      auVar119 = vsubps_avx(auVar129,auVar140);
      auVar120 = vsubps_avx(auVar138,auVar141);
      auVar122._4_4_ = auVar132._4_4_ * fVar161;
      auVar122._0_4_ = auVar132._0_4_ * fVar95;
      auVar122._8_4_ = auVar132._8_4_ * fVar163;
      auVar122._12_4_ = auVar132._12_4_ * fVar166;
      auVar122._16_4_ = auVar132._16_4_ * 0.0;
      auVar122._20_4_ = auVar132._20_4_ * 0.0;
      auVar122._24_4_ = auVar132._24_4_ * 0.0;
      auVar122._28_4_ = iVar2;
      auVar110 = vfmsub231ps_fma(auVar122,auVar138,auVar121);
      auVar123._4_4_ = fVar162 * auVar121._4_4_;
      auVar123._0_4_ = fVar96 * auVar121._0_4_;
      auVar123._8_4_ = fVar164 * auVar121._8_4_;
      auVar123._12_4_ = fVar167 * auVar121._12_4_;
      auVar123._16_4_ = auVar121._16_4_ * 0.0;
      auVar123._20_4_ = auVar121._20_4_ * 0.0;
      auVar123._24_4_ = auVar121._24_4_ * 0.0;
      auVar123._28_4_ = auVar133._28_4_;
      auVar113 = vfmsub231ps_fma(auVar123,auVar130,auVar134);
      auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar125,ZEXT1632(auVar110));
      auVar215._0_4_ = auVar134._0_4_ * auVar138._0_4_;
      auVar215._4_4_ = auVar134._4_4_ * auVar138._4_4_;
      auVar215._8_4_ = auVar134._8_4_ * auVar138._8_4_;
      auVar215._12_4_ = auVar134._12_4_ * auVar138._12_4_;
      auVar215._16_4_ = auVar134._16_4_ * fVar228;
      auVar215._20_4_ = auVar134._20_4_ * fVar227;
      auVar215._24_4_ = auVar134._24_4_ * fVar190;
      auVar215._28_4_ = 0;
      auVar110 = vfmsub231ps_fma(auVar215,auVar129,auVar132);
      auVar122 = vfmadd231ps_avx512vl(auVar133,auVar125,ZEXT1632(auVar110));
      auVar133 = vmulps_avx512vl(auVar120,auVar139);
      auVar133 = vfmsub231ps_avx512vl(auVar133,auVar131,auVar141);
      auVar124._4_4_ = auVar119._4_4_ * auVar141._4_4_;
      auVar124._0_4_ = auVar119._0_4_ * auVar141._0_4_;
      auVar124._8_4_ = auVar119._8_4_ * auVar141._8_4_;
      auVar124._12_4_ = auVar119._12_4_ * auVar141._12_4_;
      auVar124._16_4_ = auVar119._16_4_ * auVar141._16_4_;
      auVar124._20_4_ = auVar119._20_4_ * auVar141._20_4_;
      auVar124._24_4_ = auVar119._24_4_ * auVar141._24_4_;
      auVar124._28_4_ = auVar141._28_4_;
      auVar110 = vfmsub231ps_fma(auVar124,auVar140,auVar120);
      auVar216._0_4_ = auVar140._0_4_ * auVar131._0_4_;
      auVar216._4_4_ = auVar140._4_4_ * auVar131._4_4_;
      auVar216._8_4_ = auVar140._8_4_ * auVar131._8_4_;
      auVar216._12_4_ = auVar140._12_4_ * auVar131._12_4_;
      auVar216._16_4_ = fVar184 * auVar131._16_4_;
      auVar216._20_4_ = fVar198 * auVar131._20_4_;
      auVar216._24_4_ = fVar189 * auVar131._24_4_;
      auVar216._28_4_ = 0;
      auVar113 = vfmsub231ps_fma(auVar216,auVar119,auVar139);
      auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar125,auVar133);
      auVar123 = vfmadd231ps_avx512vl(auVar133,auVar125,ZEXT1632(auVar110));
      auVar219 = ZEXT3264(auVar123);
      auVar133 = vmaxps_avx(auVar122,auVar123);
      uVar185 = vcmpps_avx512vl(auVar133,auVar125,2);
      bVar93 = bVar93 & (byte)uVar185;
      if (bVar93 != 0) {
        auVar43._4_4_ = auVar120._4_4_ * auVar134._4_4_;
        auVar43._0_4_ = auVar120._0_4_ * auVar134._0_4_;
        auVar43._8_4_ = auVar120._8_4_ * auVar134._8_4_;
        auVar43._12_4_ = auVar120._12_4_ * auVar134._12_4_;
        auVar43._16_4_ = auVar120._16_4_ * auVar134._16_4_;
        auVar43._20_4_ = auVar120._20_4_ * auVar134._20_4_;
        auVar43._24_4_ = auVar120._24_4_ * auVar134._24_4_;
        auVar43._28_4_ = auVar133._28_4_;
        auVar106 = vfmsub231ps_fma(auVar43,auVar119,auVar132);
        auVar44._4_4_ = auVar132._4_4_ * auVar131._4_4_;
        auVar44._0_4_ = auVar132._0_4_ * auVar131._0_4_;
        auVar44._8_4_ = auVar132._8_4_ * auVar131._8_4_;
        auVar44._12_4_ = auVar132._12_4_ * auVar131._12_4_;
        auVar44._16_4_ = auVar132._16_4_ * auVar131._16_4_;
        auVar44._20_4_ = auVar132._20_4_ * auVar131._20_4_;
        auVar44._24_4_ = auVar132._24_4_ * auVar131._24_4_;
        auVar44._28_4_ = auVar132._28_4_;
        auVar112 = vfmsub231ps_fma(auVar44,auVar121,auVar120);
        auVar45._4_4_ = auVar119._4_4_ * auVar121._4_4_;
        auVar45._0_4_ = auVar119._0_4_ * auVar121._0_4_;
        auVar45._8_4_ = auVar119._8_4_ * auVar121._8_4_;
        auVar45._12_4_ = auVar119._12_4_ * auVar121._12_4_;
        auVar45._16_4_ = auVar119._16_4_ * auVar121._16_4_;
        auVar45._20_4_ = auVar119._20_4_ * auVar121._20_4_;
        auVar45._24_4_ = auVar119._24_4_ * auVar121._24_4_;
        auVar45._28_4_ = auVar119._28_4_;
        auVar102 = vfmsub231ps_fma(auVar45,auVar131,auVar134);
        auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar102));
        auVar113 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar106),
                                   ZEXT1232(ZEXT412(0)) << 0x20);
        auVar133 = vrcp14ps_avx512vl(ZEXT1632(auVar113));
        auVar224 = ZEXT3264(auVar133);
        auVar36._8_4_ = 0x3f800000;
        auVar36._0_8_ = 0x3f8000003f800000;
        auVar36._12_4_ = 0x3f800000;
        auVar36._16_4_ = 0x3f800000;
        auVar36._20_4_ = 0x3f800000;
        auVar36._24_4_ = 0x3f800000;
        auVar36._28_4_ = 0x3f800000;
        auVar134 = vfnmadd213ps_avx512vl(auVar133,ZEXT1632(auVar113),auVar36);
        auVar110 = vfmadd132ps_fma(auVar134,auVar133,auVar133);
        auVar222 = ZEXT1664(auVar110);
        auVar46._4_4_ = auVar102._4_4_ * auVar138._4_4_;
        auVar46._0_4_ = auVar102._0_4_ * auVar138._0_4_;
        auVar46._8_4_ = auVar102._8_4_ * auVar138._8_4_;
        auVar46._12_4_ = auVar102._12_4_ * auVar138._12_4_;
        auVar46._16_4_ = fVar228 * 0.0;
        auVar46._20_4_ = fVar227 * 0.0;
        auVar46._24_4_ = fVar190 * 0.0;
        auVar46._28_4_ = iVar1;
        auVar112 = vfmadd231ps_fma(auVar46,auVar129,ZEXT1632(auVar112));
        auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar130,ZEXT1632(auVar106));
        fVar190 = auVar110._0_4_;
        fVar227 = auVar110._4_4_;
        fVar228 = auVar110._8_4_;
        fVar184 = auVar110._12_4_;
        local_7a0 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar184,
                                       CONCAT48(auVar112._8_4_ * fVar228,
                                                CONCAT44(auVar112._4_4_ * fVar227,
                                                         auVar112._0_4_ * fVar190))));
        auVar159 = ZEXT3264(local_7a0);
        auVar174._4_4_ = local_760;
        auVar174._0_4_ = local_760;
        auVar174._8_4_ = local_760;
        auVar174._12_4_ = local_760;
        auVar174._16_4_ = local_760;
        auVar174._20_4_ = local_760;
        auVar174._24_4_ = local_760;
        auVar174._28_4_ = local_760;
        uVar185 = vcmpps_avx512vl(auVar174,local_7a0,2);
        uVar183 = *(undefined4 *)(ray + k * 4 + 0x200);
        auVar37._4_4_ = uVar183;
        auVar37._0_4_ = uVar183;
        auVar37._8_4_ = uVar183;
        auVar37._12_4_ = uVar183;
        auVar37._16_4_ = uVar183;
        auVar37._20_4_ = uVar183;
        auVar37._24_4_ = uVar183;
        auVar37._28_4_ = uVar183;
        uVar29 = vcmpps_avx512vl(local_7a0,auVar37,2);
        bVar93 = (byte)uVar185 & (byte)uVar29 & bVar93;
        if (bVar93 != 0) {
          uVar94 = vcmpps_avx512vl(ZEXT1632(auVar113),ZEXT1232(ZEXT412(0)) << 0x20,4);
          uVar94 = bVar93 & uVar94;
          if ((char)uVar94 != '\0') {
            fVar189 = auVar122._0_4_ * fVar190;
            fVar198 = auVar122._4_4_ * fVar227;
            auVar47._4_4_ = fVar198;
            auVar47._0_4_ = fVar189;
            fVar95 = auVar122._8_4_ * fVar228;
            auVar47._8_4_ = fVar95;
            fVar96 = auVar122._12_4_ * fVar184;
            auVar47._12_4_ = fVar96;
            fVar161 = auVar122._16_4_ * 0.0;
            auVar47._16_4_ = fVar161;
            fVar162 = auVar122._20_4_ * 0.0;
            auVar47._20_4_ = fVar162;
            fVar163 = auVar122._24_4_ * 0.0;
            auVar47._24_4_ = fVar163;
            auVar47._28_4_ = auVar122._28_4_;
            auVar175._8_4_ = 0x3f800000;
            auVar175._0_8_ = 0x3f8000003f800000;
            auVar175._12_4_ = 0x3f800000;
            auVar175._16_4_ = 0x3f800000;
            auVar175._20_4_ = 0x3f800000;
            auVar175._24_4_ = 0x3f800000;
            auVar175._28_4_ = 0x3f800000;
            auVar133 = vsubps_avx(auVar175,auVar47);
            local_5e0._0_4_ =
                 (float)((uint)(bVar85 & 1) * (int)fVar189 |
                        (uint)!(bool)(bVar85 & 1) * auVar133._0_4_);
            bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
            local_5e0._4_4_ = (float)((uint)bVar12 * (int)fVar198 | (uint)!bVar12 * auVar133._4_4_);
            bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
            local_5e0._8_4_ = (float)((uint)bVar12 * (int)fVar95 | (uint)!bVar12 * auVar133._8_4_);
            bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
            local_5e0._12_4_ = (float)((uint)bVar12 * (int)fVar96 | (uint)!bVar12 * auVar133._12_4_)
            ;
            bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
            local_5e0._16_4_ =
                 (float)((uint)bVar12 * (int)fVar161 | (uint)!bVar12 * auVar133._16_4_);
            bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
            local_5e0._20_4_ =
                 (float)((uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar133._20_4_);
            bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
            local_5e0._24_4_ =
                 (float)((uint)bVar12 * (int)fVar163 | (uint)!bVar12 * auVar133._24_4_);
            bVar12 = SUB81(uVar88 >> 7,0);
            local_5e0._28_4_ =
                 (float)((uint)bVar12 * auVar122._28_4_ | (uint)!bVar12 * auVar133._28_4_);
            auVar133 = vsubps_avx(ZEXT1632(auVar107),auVar126);
            auVar110 = vfmadd213ps_fma(auVar133,local_5e0,auVar126);
            uVar183 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
            auVar126._4_4_ = uVar183;
            auVar126._0_4_ = uVar183;
            auVar126._8_4_ = uVar183;
            auVar126._12_4_ = uVar183;
            auVar126._16_4_ = uVar183;
            auVar126._20_4_ = uVar183;
            auVar126._24_4_ = uVar183;
            auVar126._28_4_ = uVar183;
            auVar133 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar110._12_4_ + auVar110._12_4_,
                                                          CONCAT48(auVar110._8_4_ + auVar110._8_4_,
                                                                   CONCAT44(auVar110._4_4_ +
                                                                            auVar110._4_4_,
                                                                            auVar110._0_4_ +
                                                                            auVar110._0_4_)))),
                                       auVar126);
            uVar28 = vcmpps_avx512vl(local_7a0,auVar133,6);
            uVar94 = uVar94 & uVar28;
            bVar93 = (byte)uVar94;
            if (bVar93 != 0) {
              auVar196._0_4_ = auVar123._0_4_ * fVar190;
              auVar196._4_4_ = auVar123._4_4_ * fVar227;
              auVar196._8_4_ = auVar123._8_4_ * fVar228;
              auVar196._12_4_ = auVar123._12_4_ * fVar184;
              auVar196._16_4_ = auVar123._16_4_ * 0.0;
              auVar196._20_4_ = auVar123._20_4_ * 0.0;
              auVar196._24_4_ = auVar123._24_4_ * 0.0;
              auVar196._28_4_ = 0;
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = 0x3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar133 = vsubps_avx(auVar204,auVar196);
              auVar144._0_4_ =
                   (uint)(bVar85 & 1) * (int)auVar196._0_4_ |
                   (uint)!(bool)(bVar85 & 1) * auVar133._0_4_;
              bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
              auVar144._4_4_ = (uint)bVar12 * (int)auVar196._4_4_ | (uint)!bVar12 * auVar133._4_4_;
              bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
              auVar144._8_4_ = (uint)bVar12 * (int)auVar196._8_4_ | (uint)!bVar12 * auVar133._8_4_;
              bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
              auVar144._12_4_ =
                   (uint)bVar12 * (int)auVar196._12_4_ | (uint)!bVar12 * auVar133._12_4_;
              bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
              auVar144._16_4_ =
                   (uint)bVar12 * (int)auVar196._16_4_ | (uint)!bVar12 * auVar133._16_4_;
              bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
              auVar144._20_4_ =
                   (uint)bVar12 * (int)auVar196._20_4_ | (uint)!bVar12 * auVar133._20_4_;
              bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
              auVar144._24_4_ =
                   (uint)bVar12 * (int)auVar196._24_4_ | (uint)!bVar12 * auVar133._24_4_;
              auVar144._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar133._28_4_;
              auVar38._8_4_ = 0x40000000;
              auVar38._0_8_ = 0x4000000040000000;
              auVar38._12_4_ = 0x40000000;
              auVar38._16_4_ = 0x40000000;
              auVar38._20_4_ = 0x40000000;
              auVar38._24_4_ = 0x40000000;
              auVar38._28_4_ = 0x40000000;
              local_5c0 = vfmsub132ps_avx512vl(auVar144,auVar204,auVar38);
              local_580 = 0;
              local_570 = local_840;
              uStack_568 = uStack_838;
              local_560 = local_850;
              uStack_558 = uStack_848;
              local_550 = local_860;
              uStack_548 = uStack_858;
              local_540 = local_870;
              uStack_538 = uStack_868;
              if ((pGVar91->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                fVar190 = 1.0 / auVar127._0_4_;
                local_520[0] = fVar190 * (local_5e0._0_4_ + 0.0);
                local_520[1] = fVar190 * (local_5e0._4_4_ + 1.0);
                local_520[2] = fVar190 * (local_5e0._8_4_ + 2.0);
                local_520[3] = fVar190 * (local_5e0._12_4_ + 3.0);
                fStack_510 = fVar190 * (local_5e0._16_4_ + 4.0);
                fStack_50c = fVar190 * (local_5e0._20_4_ + 5.0);
                fStack_508 = fVar190 * (local_5e0._24_4_ + 6.0);
                fStack_504 = local_5e0._28_4_ + 7.0;
                local_500 = local_5c0;
                local_4e0 = local_7a0;
                auVar176._8_4_ = 0x7f800000;
                auVar176._0_8_ = 0x7f8000007f800000;
                auVar176._12_4_ = 0x7f800000;
                auVar176._16_4_ = 0x7f800000;
                auVar176._20_4_ = 0x7f800000;
                auVar176._24_4_ = 0x7f800000;
                auVar176._28_4_ = 0x7f800000;
                auVar133 = vblendmps_avx512vl(auVar176,local_7a0);
                auVar145._0_4_ =
                     (uint)(bVar93 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                bVar12 = (bool)((byte)(uVar94 >> 1) & 1);
                auVar145._4_4_ = (uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar94 >> 2) & 1);
                auVar145._8_4_ = (uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar94 >> 3) & 1);
                auVar145._12_4_ = (uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar94 >> 4) & 1);
                auVar145._16_4_ = (uint)bVar12 * auVar133._16_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar94 >> 5) & 1);
                auVar145._20_4_ = (uint)bVar12 * auVar133._20_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                auVar145._24_4_ = (uint)bVar12 * auVar133._24_4_ | (uint)!bVar12 * 0x7f800000;
                bVar12 = SUB81(uVar94 >> 7,0);
                auVar145._28_4_ = (uint)bVar12 * auVar133._28_4_ | (uint)!bVar12 * 0x7f800000;
                auVar133 = vshufps_avx(auVar145,auVar145,0xb1);
                auVar133 = vminps_avx(auVar145,auVar133);
                auVar134 = vshufpd_avx(auVar133,auVar133,5);
                auVar133 = vminps_avx(auVar133,auVar134);
                auVar134 = vpermpd_avx2(auVar133,0x4e);
                auVar133 = vminps_avx(auVar133,auVar134);
                uVar185 = vcmpps_avx512vl(auVar145,auVar133,0);
                uVar87 = (uint)uVar94;
                if ((bVar93 & (byte)uVar185) != 0) {
                  uVar87 = (uint)(bVar93 & (byte)uVar185);
                }
                uVar30 = 0;
                for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
                  uVar30 = uVar30 + 1;
                }
                uVar88 = (ulong)uVar30;
                if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                   (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                  local_780._0_16_ = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                  local_5a0 = local_7a0;
                  local_57c = iVar7;
                  do {
                    local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar88]));
                    local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar88 * 4)));
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar88 * 4);
                    local_830.context = context->user;
                    fVar184 = local_200._0_4_;
                    fVar190 = 1.0 - fVar184;
                    auVar35._8_4_ = 0x80000000;
                    auVar35._0_8_ = 0x8000000080000000;
                    auVar35._12_4_ = 0x80000000;
                    auVar112 = vxorps_avx512vl(ZEXT416((uint)fVar190),auVar35);
                    auVar110 = ZEXT416((uint)(fVar184 * fVar190 * 4.0));
                    auVar113 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar110);
                    auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),
                                               auVar110);
                    auVar224 = ZEXT464(0x3f000000);
                    fVar190 = fVar190 * auVar112._0_4_ * 0.5;
                    fVar227 = auVar113._0_4_ * 0.5;
                    fVar228 = auVar110._0_4_ * 0.5;
                    fVar184 = fVar184 * fVar184 * 0.5;
                    auVar221._0_4_ = fVar184 * fVar26;
                    auVar221._4_4_ = fVar184 * fVar68;
                    auVar221._8_4_ = fVar184 * fVar69;
                    auVar221._12_4_ = fVar184 * fVar70;
                    auVar172._4_4_ = fVar228;
                    auVar172._0_4_ = fVar228;
                    auVar172._8_4_ = fVar228;
                    auVar172._12_4_ = fVar228;
                    auVar110 = vfmadd132ps_fma(auVar172,auVar221,auVar108);
                    auVar214._4_4_ = fVar227;
                    auVar214._0_4_ = fVar227;
                    auVar214._8_4_ = fVar227;
                    auVar214._12_4_ = fVar227;
                    auVar110 = vfmadd132ps_fma(auVar214,auVar110,auVar27);
                    auVar173._4_4_ = fVar190;
                    auVar173._0_4_ = fVar190;
                    auVar173._8_4_ = fVar190;
                    auVar173._12_4_ = fVar190;
                    auVar110 = vfmadd132ps_fma(auVar173,auVar110,auVar111);
                    auVar160 = vbroadcastss_avx512f(auVar110);
                    auVar219 = vbroadcastss_avx512f(ZEXT416(1));
                    auVar219 = vpermps_avx512f(auVar219,ZEXT1664(auVar110));
                    auVar222 = vbroadcastss_avx512f(ZEXT416(2));
                    local_240 = vpermps_avx512f(auVar222,ZEXT1664(auVar110));
                    local_2c0[0] = (RTCHitN)auVar160[0];
                    local_2c0[1] = (RTCHitN)auVar160[1];
                    local_2c0[2] = (RTCHitN)auVar160[2];
                    local_2c0[3] = (RTCHitN)auVar160[3];
                    local_2c0[4] = (RTCHitN)auVar160[4];
                    local_2c0[5] = (RTCHitN)auVar160[5];
                    local_2c0[6] = (RTCHitN)auVar160[6];
                    local_2c0[7] = (RTCHitN)auVar160[7];
                    local_2c0[8] = (RTCHitN)auVar160[8];
                    local_2c0[9] = (RTCHitN)auVar160[9];
                    local_2c0[10] = (RTCHitN)auVar160[10];
                    local_2c0[0xb] = (RTCHitN)auVar160[0xb];
                    local_2c0[0xc] = (RTCHitN)auVar160[0xc];
                    local_2c0[0xd] = (RTCHitN)auVar160[0xd];
                    local_2c0[0xe] = (RTCHitN)auVar160[0xe];
                    local_2c0[0xf] = (RTCHitN)auVar160[0xf];
                    local_2c0[0x10] = (RTCHitN)auVar160[0x10];
                    local_2c0[0x11] = (RTCHitN)auVar160[0x11];
                    local_2c0[0x12] = (RTCHitN)auVar160[0x12];
                    local_2c0[0x13] = (RTCHitN)auVar160[0x13];
                    local_2c0[0x14] = (RTCHitN)auVar160[0x14];
                    local_2c0[0x15] = (RTCHitN)auVar160[0x15];
                    local_2c0[0x16] = (RTCHitN)auVar160[0x16];
                    local_2c0[0x17] = (RTCHitN)auVar160[0x17];
                    local_2c0[0x18] = (RTCHitN)auVar160[0x18];
                    local_2c0[0x19] = (RTCHitN)auVar160[0x19];
                    local_2c0[0x1a] = (RTCHitN)auVar160[0x1a];
                    local_2c0[0x1b] = (RTCHitN)auVar160[0x1b];
                    local_2c0[0x1c] = (RTCHitN)auVar160[0x1c];
                    local_2c0[0x1d] = (RTCHitN)auVar160[0x1d];
                    local_2c0[0x1e] = (RTCHitN)auVar160[0x1e];
                    local_2c0[0x1f] = (RTCHitN)auVar160[0x1f];
                    local_2c0[0x20] = (RTCHitN)auVar160[0x20];
                    local_2c0[0x21] = (RTCHitN)auVar160[0x21];
                    local_2c0[0x22] = (RTCHitN)auVar160[0x22];
                    local_2c0[0x23] = (RTCHitN)auVar160[0x23];
                    local_2c0[0x24] = (RTCHitN)auVar160[0x24];
                    local_2c0[0x25] = (RTCHitN)auVar160[0x25];
                    local_2c0[0x26] = (RTCHitN)auVar160[0x26];
                    local_2c0[0x27] = (RTCHitN)auVar160[0x27];
                    local_2c0[0x28] = (RTCHitN)auVar160[0x28];
                    local_2c0[0x29] = (RTCHitN)auVar160[0x29];
                    local_2c0[0x2a] = (RTCHitN)auVar160[0x2a];
                    local_2c0[0x2b] = (RTCHitN)auVar160[0x2b];
                    local_2c0[0x2c] = (RTCHitN)auVar160[0x2c];
                    local_2c0[0x2d] = (RTCHitN)auVar160[0x2d];
                    local_2c0[0x2e] = (RTCHitN)auVar160[0x2e];
                    local_2c0[0x2f] = (RTCHitN)auVar160[0x2f];
                    local_2c0[0x30] = (RTCHitN)auVar160[0x30];
                    local_2c0[0x31] = (RTCHitN)auVar160[0x31];
                    local_2c0[0x32] = (RTCHitN)auVar160[0x32];
                    local_2c0[0x33] = (RTCHitN)auVar160[0x33];
                    local_2c0[0x34] = (RTCHitN)auVar160[0x34];
                    local_2c0[0x35] = (RTCHitN)auVar160[0x35];
                    local_2c0[0x36] = (RTCHitN)auVar160[0x36];
                    local_2c0[0x37] = (RTCHitN)auVar160[0x37];
                    local_2c0[0x38] = (RTCHitN)auVar160[0x38];
                    local_2c0[0x39] = (RTCHitN)auVar160[0x39];
                    local_2c0[0x3a] = (RTCHitN)auVar160[0x3a];
                    local_2c0[0x3b] = (RTCHitN)auVar160[0x3b];
                    local_2c0[0x3c] = (RTCHitN)auVar160[0x3c];
                    local_2c0[0x3d] = (RTCHitN)auVar160[0x3d];
                    local_2c0[0x3e] = (RTCHitN)auVar160[0x3e];
                    local_2c0[0x3f] = (RTCHitN)auVar160[0x3f];
                    local_280 = auVar219;
                    local_180 = local_340._0_8_;
                    uStack_178 = local_340._8_8_;
                    uStack_170 = local_340._16_8_;
                    uStack_168 = local_340._24_8_;
                    uStack_160 = local_340._32_8_;
                    uStack_158 = local_340._40_8_;
                    uStack_150 = local_340._48_8_;
                    uStack_148 = local_340._56_8_;
                    auVar160 = vmovdqa64_avx512f(local_300);
                    local_140 = vmovdqa64_avx512f(auVar160);
                    auVar133 = vpcmpeqd_avx2(auVar160._0_32_,auVar160._0_32_);
                    local_7e8[3] = auVar133;
                    local_7e8[2] = auVar133;
                    local_7e8[1] = auVar133;
                    *local_7e8 = auVar133;
                    local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                    local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]));
                    auVar160 = vmovdqa64_avx512f(local_380);
                    local_740 = vmovdqa64_avx512f(auVar160);
                    local_830.valid = (int *)local_740;
                    local_830.geometryUserPtr = pGVar91->userPtr;
                    local_830.hit = local_2c0;
                    local_830.N = 0x10;
                    local_830.ray = (RTCRayN *)ray;
                    if (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar219 = ZEXT1664(auVar219._0_16_);
                      auVar222 = ZEXT1664(auVar222._0_16_);
                      auVar224 = ZEXT1664(auVar224._0_16_);
                      (*pGVar91->intersectionFilterN)(&local_830);
                      auVar159 = ZEXT3264(local_7a0);
                      auVar182 = ZEXT464(0xbf800000);
                      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar243 = ZEXT1664(auVar110);
                      auVar160 = vmovdqa64_avx512f(local_740);
                    }
                    uVar185 = vptestmd_avx512f(auVar160,auVar160);
                    if ((short)uVar185 == 0) {
LAB_018ee458:
                      *(undefined4 *)(ray + k * 4 + 0x200) = local_780._0_4_;
                    }
                    else {
                      p_Var11 = context->args->filter;
                      if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar91->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar219 = ZEXT1664(auVar219._0_16_);
                        auVar222 = ZEXT1664(auVar222._0_16_);
                        auVar224 = ZEXT1664(auVar224._0_16_);
                        (*p_Var11)(&local_830);
                        auVar159 = ZEXT3264(local_7a0);
                        auVar182 = ZEXT464(0xbf800000);
                        auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar243 = ZEXT1664(auVar110);
                        auVar160 = vmovdqa64_avx512f(local_740);
                      }
                      uVar28 = vptestmd_avx512f(auVar160,auVar160);
                      if ((short)uVar28 == 0) goto LAB_018ee458;
                      iVar1 = *(int *)(local_830.hit + 4);
                      iVar2 = *(int *)(local_830.hit + 8);
                      iVar71 = *(int *)(local_830.hit + 0xc);
                      iVar72 = *(int *)(local_830.hit + 0x10);
                      iVar73 = *(int *)(local_830.hit + 0x14);
                      iVar74 = *(int *)(local_830.hit + 0x18);
                      iVar75 = *(int *)(local_830.hit + 0x1c);
                      iVar76 = *(int *)(local_830.hit + 0x20);
                      iVar77 = *(int *)(local_830.hit + 0x24);
                      iVar78 = *(int *)(local_830.hit + 0x28);
                      iVar79 = *(int *)(local_830.hit + 0x2c);
                      iVar80 = *(int *)(local_830.hit + 0x30);
                      iVar81 = *(int *)(local_830.hit + 0x34);
                      iVar82 = *(int *)(local_830.hit + 0x38);
                      iVar83 = *(int *)(local_830.hit + 0x3c);
                      bVar93 = (byte)uVar28;
                      bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar85 = (byte)(uVar28 >> 8);
                      bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar25 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x300) =
                           (uint)(bVar93 & 1) * *(int *)local_830.hit |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x300);
                      *(uint *)(local_830.ray + 0x304) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_830.ray + 0x304);
                      *(uint *)(local_830.ray + 0x308) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_830.ray + 0x308);
                      *(uint *)(local_830.ray + 0x30c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_830.ray + 0x30c);
                      *(uint *)(local_830.ray + 0x310) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_830.ray + 0x310);
                      *(uint *)(local_830.ray + 0x314) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_830.ray + 0x314);
                      *(uint *)(local_830.ray + 0x318) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_830.ray + 0x318);
                      *(uint *)(local_830.ray + 0x31c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_830.ray + 0x31c);
                      *(uint *)(local_830.ray + 800) =
                           (uint)(bVar85 & 1) * iVar76 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 800);
                      *(uint *)(local_830.ray + 0x324) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x324);
                      *(uint *)(local_830.ray + 0x328) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x328);
                      *(uint *)(local_830.ray + 0x32c) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_830.ray + 0x32c);
                      *(uint *)(local_830.ray + 0x330) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x330);
                      *(uint *)(local_830.ray + 0x334) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x334);
                      *(uint *)(local_830.ray + 0x338) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x338);
                      *(uint *)(local_830.ray + 0x33c) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x33c);
                      iVar1 = *(int *)(local_830.hit + 0x44);
                      iVar2 = *(int *)(local_830.hit + 0x48);
                      iVar71 = *(int *)(local_830.hit + 0x4c);
                      iVar72 = *(int *)(local_830.hit + 0x50);
                      iVar73 = *(int *)(local_830.hit + 0x54);
                      iVar74 = *(int *)(local_830.hit + 0x58);
                      iVar75 = *(int *)(local_830.hit + 0x5c);
                      iVar76 = *(int *)(local_830.hit + 0x60);
                      iVar77 = *(int *)(local_830.hit + 100);
                      iVar78 = *(int *)(local_830.hit + 0x68);
                      iVar79 = *(int *)(local_830.hit + 0x6c);
                      iVar80 = *(int *)(local_830.hit + 0x70);
                      iVar81 = *(int *)(local_830.hit + 0x74);
                      iVar82 = *(int *)(local_830.hit + 0x78);
                      iVar83 = *(int *)(local_830.hit + 0x7c);
                      bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar25 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x340) =
                           (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0x40) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x340);
                      *(uint *)(local_830.ray + 0x344) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_830.ray + 0x344);
                      *(uint *)(local_830.ray + 0x348) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_830.ray + 0x348);
                      *(uint *)(local_830.ray + 0x34c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_830.ray + 0x34c);
                      *(uint *)(local_830.ray + 0x350) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_830.ray + 0x350);
                      *(uint *)(local_830.ray + 0x354) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_830.ray + 0x354);
                      *(uint *)(local_830.ray + 0x358) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_830.ray + 0x358);
                      *(uint *)(local_830.ray + 0x35c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_830.ray + 0x35c);
                      *(uint *)(local_830.ray + 0x360) =
                           (uint)(bVar85 & 1) * iVar76 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x360);
                      *(uint *)(local_830.ray + 0x364) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x364);
                      *(uint *)(local_830.ray + 0x368) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x368);
                      *(uint *)(local_830.ray + 0x36c) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_830.ray + 0x36c);
                      *(uint *)(local_830.ray + 0x370) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x370);
                      *(uint *)(local_830.ray + 0x374) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x374);
                      *(uint *)(local_830.ray + 0x378) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x378);
                      *(uint *)(local_830.ray + 0x37c) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x37c);
                      iVar1 = *(int *)(local_830.hit + 0x84);
                      iVar2 = *(int *)(local_830.hit + 0x88);
                      iVar71 = *(int *)(local_830.hit + 0x8c);
                      iVar72 = *(int *)(local_830.hit + 0x90);
                      iVar73 = *(int *)(local_830.hit + 0x94);
                      iVar74 = *(int *)(local_830.hit + 0x98);
                      iVar75 = *(int *)(local_830.hit + 0x9c);
                      iVar76 = *(int *)(local_830.hit + 0xa0);
                      iVar77 = *(int *)(local_830.hit + 0xa4);
                      iVar78 = *(int *)(local_830.hit + 0xa8);
                      iVar79 = *(int *)(local_830.hit + 0xac);
                      iVar80 = *(int *)(local_830.hit + 0xb0);
                      iVar81 = *(int *)(local_830.hit + 0xb4);
                      iVar82 = *(int *)(local_830.hit + 0xb8);
                      iVar83 = *(int *)(local_830.hit + 0xbc);
                      bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar25 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x380) =
                           (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0x80) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x380);
                      *(uint *)(local_830.ray + 900) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_830.ray + 900);
                      *(uint *)(local_830.ray + 0x388) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_830.ray + 0x388);
                      *(uint *)(local_830.ray + 0x38c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_830.ray + 0x38c);
                      *(uint *)(local_830.ray + 0x390) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_830.ray + 0x390);
                      *(uint *)(local_830.ray + 0x394) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_830.ray + 0x394);
                      *(uint *)(local_830.ray + 0x398) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_830.ray + 0x398);
                      *(uint *)(local_830.ray + 0x39c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_830.ray + 0x39c);
                      *(uint *)(local_830.ray + 0x3a0) =
                           (uint)(bVar85 & 1) * iVar76 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x3a0);
                      *(uint *)(local_830.ray + 0x3a4) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3a4);
                      *(uint *)(local_830.ray + 0x3a8) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x3a8);
                      *(uint *)(local_830.ray + 0x3ac) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_830.ray + 0x3ac);
                      *(uint *)(local_830.ray + 0x3b0) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3b0);
                      *(uint *)(local_830.ray + 0x3b4) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3b4);
                      *(uint *)(local_830.ray + 0x3b8) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3b8);
                      *(uint *)(local_830.ray + 0x3bc) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3bc);
                      iVar1 = *(int *)(local_830.hit + 0xc4);
                      iVar2 = *(int *)(local_830.hit + 200);
                      iVar71 = *(int *)(local_830.hit + 0xcc);
                      iVar72 = *(int *)(local_830.hit + 0xd0);
                      iVar73 = *(int *)(local_830.hit + 0xd4);
                      iVar74 = *(int *)(local_830.hit + 0xd8);
                      iVar75 = *(int *)(local_830.hit + 0xdc);
                      iVar76 = *(int *)(local_830.hit + 0xe0);
                      iVar77 = *(int *)(local_830.hit + 0xe4);
                      iVar78 = *(int *)(local_830.hit + 0xe8);
                      iVar79 = *(int *)(local_830.hit + 0xec);
                      iVar80 = *(int *)(local_830.hit + 0xf0);
                      iVar81 = *(int *)(local_830.hit + 0xf4);
                      iVar82 = *(int *)(local_830.hit + 0xf8);
                      iVar83 = *(int *)(local_830.hit + 0xfc);
                      bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar25 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x3c0) =
                           (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0xc0) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x3c0);
                      *(uint *)(local_830.ray + 0x3c4) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_830.ray + 0x3c4);
                      *(uint *)(local_830.ray + 0x3c8) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_830.ray + 0x3c8);
                      *(uint *)(local_830.ray + 0x3cc) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_830.ray + 0x3cc);
                      *(uint *)(local_830.ray + 0x3d0) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_830.ray + 0x3d0);
                      *(uint *)(local_830.ray + 0x3d4) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_830.ray + 0x3d4);
                      *(uint *)(local_830.ray + 0x3d8) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_830.ray + 0x3d8);
                      *(uint *)(local_830.ray + 0x3dc) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_830.ray + 0x3dc);
                      *(uint *)(local_830.ray + 0x3e0) =
                           (uint)(bVar85 & 1) * iVar76 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x3e0);
                      *(uint *)(local_830.ray + 0x3e4) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x3e4);
                      *(uint *)(local_830.ray + 1000) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 1000);
                      *(uint *)(local_830.ray + 0x3ec) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_830.ray + 0x3ec);
                      *(uint *)(local_830.ray + 0x3f0) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x3f0);
                      *(uint *)(local_830.ray + 0x3f4) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x3f4);
                      *(uint *)(local_830.ray + 0x3f8) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x3f8);
                      *(uint *)(local_830.ray + 0x3fc) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x3fc);
                      iVar1 = *(int *)(local_830.hit + 0x104);
                      iVar2 = *(int *)(local_830.hit + 0x108);
                      iVar71 = *(int *)(local_830.hit + 0x10c);
                      iVar72 = *(int *)(local_830.hit + 0x110);
                      iVar73 = *(int *)(local_830.hit + 0x114);
                      iVar74 = *(int *)(local_830.hit + 0x118);
                      iVar75 = *(int *)(local_830.hit + 0x11c);
                      iVar76 = *(int *)(local_830.hit + 0x120);
                      iVar77 = *(int *)(local_830.hit + 0x124);
                      iVar78 = *(int *)(local_830.hit + 0x128);
                      iVar79 = *(int *)(local_830.hit + 300);
                      iVar80 = *(int *)(local_830.hit + 0x130);
                      iVar81 = *(int *)(local_830.hit + 0x134);
                      iVar82 = *(int *)(local_830.hit + 0x138);
                      iVar83 = *(int *)(local_830.hit + 0x13c);
                      bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                      bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                      bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                      bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                      bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                      bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                      bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                      bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                      bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                      bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                      bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                      bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                      bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                      bVar25 = SUB81(uVar28 >> 0xf,0);
                      *(uint *)(local_830.ray + 0x400) =
                           (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0x100) |
                           (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x400);
                      *(uint *)(local_830.ray + 0x404) =
                           (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_830.ray + 0x404);
                      *(uint *)(local_830.ray + 0x408) =
                           (uint)bVar13 * iVar2 | (uint)!bVar13 * *(int *)(local_830.ray + 0x408);
                      *(uint *)(local_830.ray + 0x40c) =
                           (uint)bVar14 * iVar71 | (uint)!bVar14 * *(int *)(local_830.ray + 0x40c);
                      *(uint *)(local_830.ray + 0x410) =
                           (uint)bVar15 * iVar72 | (uint)!bVar15 * *(int *)(local_830.ray + 0x410);
                      *(uint *)(local_830.ray + 0x414) =
                           (uint)bVar16 * iVar73 | (uint)!bVar16 * *(int *)(local_830.ray + 0x414);
                      *(uint *)(local_830.ray + 0x418) =
                           (uint)bVar17 * iVar74 | (uint)!bVar17 * *(int *)(local_830.ray + 0x418);
                      *(uint *)(local_830.ray + 0x41c) =
                           (uint)bVar18 * iVar75 | (uint)!bVar18 * *(int *)(local_830.ray + 0x41c);
                      *(uint *)(local_830.ray + 0x420) =
                           (uint)(bVar85 & 1) * iVar76 |
                           (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x420);
                      *(uint *)(local_830.ray + 0x424) =
                           (uint)bVar19 * iVar77 | (uint)!bVar19 * *(int *)(local_830.ray + 0x424);
                      *(uint *)(local_830.ray + 0x428) =
                           (uint)bVar20 * iVar78 | (uint)!bVar20 * *(int *)(local_830.ray + 0x428);
                      *(uint *)(local_830.ray + 0x42c) =
                           (uint)bVar21 * iVar79 | (uint)!bVar21 * *(int *)(local_830.ray + 0x42c);
                      *(uint *)(local_830.ray + 0x430) =
                           (uint)bVar22 * iVar80 | (uint)!bVar22 * *(int *)(local_830.ray + 0x430);
                      *(uint *)(local_830.ray + 0x434) =
                           (uint)bVar23 * iVar81 | (uint)!bVar23 * *(int *)(local_830.ray + 0x434);
                      *(uint *)(local_830.ray + 0x438) =
                           (uint)bVar24 * iVar82 | (uint)!bVar24 * *(int *)(local_830.ray + 0x438);
                      *(uint *)(local_830.ray + 0x43c) =
                           (uint)bVar25 * iVar83 | (uint)!bVar25 * *(int *)(local_830.ray + 0x43c);
                      auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140));
                      auVar160 = vmovdqu32_avx512f(auVar160);
                      *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar160;
                      auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180));
                      auVar160 = vmovdqu32_avx512f(auVar160);
                      *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar160;
                      auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0));
                      auVar160 = vmovdqa32_avx512f(auVar160);
                      *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar160;
                      auVar160 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200));
                      auVar160 = vmovdqa32_avx512f(auVar160);
                      *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar160;
                      local_780._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                      local_780._4_4_ = 0;
                      local_780._8_4_ = 0;
                      local_780._12_4_ = 0;
                    }
                    bVar93 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & (byte)uVar94;
                    auVar180._4_4_ = local_780._0_4_;
                    auVar180._0_4_ = local_780._0_4_;
                    auVar180._8_4_ = local_780._0_4_;
                    auVar180._12_4_ = local_780._0_4_;
                    auVar180._16_4_ = local_780._0_4_;
                    auVar180._20_4_ = local_780._0_4_;
                    auVar180._24_4_ = local_780._0_4_;
                    auVar180._28_4_ = local_780._0_4_;
                    uVar185 = vcmpps_avx512vl(auVar159._0_32_,auVar180,2);
                    if ((bVar93 & (byte)uVar185) == 0) goto LAB_018ed3bb;
                    bVar93 = bVar93 & (byte)uVar185;
                    uVar94 = (ulong)bVar93;
                    auVar181._8_4_ = 0x7f800000;
                    auVar181._0_8_ = 0x7f8000007f800000;
                    auVar181._12_4_ = 0x7f800000;
                    auVar181._16_4_ = 0x7f800000;
                    auVar181._20_4_ = 0x7f800000;
                    auVar181._24_4_ = 0x7f800000;
                    auVar181._28_4_ = 0x7f800000;
                    auVar133 = vblendmps_avx512vl(auVar181,auVar159._0_32_);
                    auVar158._0_4_ =
                         (uint)(bVar93 & 1) * auVar133._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar12 = (bool)(bVar93 >> 1 & 1);
                    auVar158._4_4_ = (uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar93 >> 2 & 1);
                    auVar158._8_4_ = (uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar93 >> 3 & 1);
                    auVar158._12_4_ = (uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar93 >> 4 & 1);
                    auVar158._16_4_ = (uint)bVar12 * auVar133._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar93 >> 5 & 1);
                    auVar158._20_4_ = (uint)bVar12 * auVar133._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)(bVar93 >> 6 & 1);
                    auVar158._24_4_ = (uint)bVar12 * auVar133._24_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar158._28_4_ =
                         (uint)(bVar93 >> 7) * auVar133._28_4_ |
                         (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                    auVar133 = vshufps_avx(auVar158,auVar158,0xb1);
                    auVar133 = vminps_avx(auVar158,auVar133);
                    auVar134 = vshufpd_avx(auVar133,auVar133,5);
                    auVar133 = vminps_avx(auVar133,auVar134);
                    auVar134 = vpermpd_avx2(auVar133,0x4e);
                    auVar133 = vminps_avx(auVar133,auVar134);
                    uVar185 = vcmpps_avx512vl(auVar158,auVar133,0);
                    bVar85 = (byte)uVar185 & bVar93;
                    if (bVar85 != 0) {
                      bVar93 = bVar85;
                    }
                    uVar86 = 0;
                    for (uVar87 = (uint)bVar93; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000
                        ) {
                      uVar86 = uVar86 + 1;
                    }
                    uVar88 = (ulong)uVar86;
                  } while( true );
                }
                fVar190 = local_520[uVar88];
                uVar183 = *(undefined4 *)(local_500 + uVar88 * 4);
                fVar227 = 1.0 - fVar190;
                auVar31._8_4_ = 0x80000000;
                auVar31._0_8_ = 0x8000000080000000;
                auVar31._12_4_ = 0x80000000;
                auVar112 = vxorps_avx512vl(ZEXT416((uint)fVar227),auVar31);
                auVar110 = ZEXT416((uint)(fVar190 * fVar227 * 4.0));
                auVar113 = vfnmsub213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),auVar110);
                auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),auVar110);
                fVar227 = fVar227 * auVar112._0_4_ * 0.5;
                fVar228 = auVar113._0_4_ * 0.5;
                auVar222 = ZEXT464((uint)fVar228);
                fVar184 = auVar110._0_4_ * 0.5;
                fVar189 = fVar190 * fVar190 * 0.5;
                auVar209._0_4_ = fVar189 * fVar26;
                auVar209._4_4_ = fVar189 * fVar68;
                auVar209._8_4_ = fVar189 * fVar69;
                auVar209._12_4_ = fVar189 * fVar70;
                auVar192._4_4_ = fVar184;
                auVar192._0_4_ = fVar184;
                auVar192._8_4_ = fVar184;
                auVar192._12_4_ = fVar184;
                auVar110 = vfmadd132ps_fma(auVar192,auVar209,auVar108);
                auVar210._4_4_ = fVar228;
                auVar210._0_4_ = fVar228;
                auVar210._8_4_ = fVar228;
                auVar210._12_4_ = fVar228;
                auVar110 = vfmadd132ps_fma(auVar210,auVar110,auVar27);
                auVar219 = ZEXT1664(auVar110);
                auVar193._4_4_ = fVar227;
                auVar193._0_4_ = fVar227;
                auVar193._8_4_ = fVar227;
                auVar193._12_4_ = fVar227;
                auVar110 = vfmadd132ps_fma(auVar193,auVar110,auVar111);
                *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar88 * 4);
                *(int *)(ray + k * 4 + 0x300) = auVar110._0_4_;
                uVar8 = vextractps_avx(auVar110,1);
                *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                uVar8 = vextractps_avx(auVar110,2);
                *(undefined4 *)(ray + k * 4 + 0x380) = uVar8;
                *(float *)(ray + k * 4 + 0x3c0) = fVar190;
                *(undefined4 *)(ray + k * 4 + 0x400) = uVar183;
                *(uint *)(ray + k * 4 + 0x440) = uVar86;
                *(uint *)(ray + k * 4 + 0x480) = uVar6;
                *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
              }
            }
          }
        }
      }
    }
LAB_018ed3bb:
    if (8 < iVar7) {
      local_780 = vpbroadcastd_avx512vl();
      local_7a0._4_4_ = local_800._0_4_;
      local_7a0._0_4_ = local_800._0_4_;
      local_7a0._8_4_ = local_800._0_4_;
      local_7a0._12_4_ = local_800._0_4_;
      local_7a0._16_4_ = local_800._0_4_;
      local_7a0._20_4_ = local_800._0_4_;
      local_7a0._24_4_ = local_800._0_4_;
      local_7a0._28_4_ = local_800._0_4_;
      uStack_75c = local_760;
      uStack_758 = local_760;
      uStack_754 = local_760;
      uStack_750 = local_760;
      uStack_74c = local_760;
      uStack_748 = local_760;
      uStack_744 = local_760;
      local_420 = 1.0 / (float)local_7c0._0_4_;
      fStack_41c = local_420;
      fStack_418 = local_420;
      fStack_414 = local_420;
      fStack_410 = local_420;
      fStack_40c = local_420;
      fStack_408 = local_420;
      fStack_404 = local_420;
      lVar89 = 8;
LAB_018ed44e:
      if (lVar89 < iVar7) {
        auVar133 = vpbroadcastd_avx512vl();
        auVar133 = vpor_avx2(auVar133,_DAT_01fb4ba0);
        uVar29 = vpcmpd_avx512vl(auVar133,local_780,1);
        auVar133 = *(undefined1 (*) [32])(bspline_basis0 + lVar89 * 4 + lVar92);
        auVar134 = *(undefined1 (*) [32])(lVar92 + 0x21fffac + lVar89 * 4);
        auVar132 = *(undefined1 (*) [32])(lVar92 + 0x2200430 + lVar89 * 4);
        auVar131 = *(undefined1 (*) [32])(lVar92 + 0x22008b4 + lVar89 * 4);
        fVar190 = auVar131._0_4_;
        auVar160._0_4_ = fVar190 * (float)local_6c0._0_4_;
        fVar227 = auVar131._4_4_;
        auVar160._4_4_ = fVar227 * (float)local_6c0._4_4_;
        fVar228 = auVar131._8_4_;
        auVar160._8_4_ = fVar228 * fStack_6b8;
        fVar184 = auVar131._12_4_;
        auVar160._12_4_ = fVar184 * fStack_6b4;
        fVar189 = auVar131._16_4_;
        auVar160._16_4_ = fVar189 * fStack_6b0;
        fVar198 = auVar131._20_4_;
        auVar160._20_4_ = fVar198 * fStack_6ac;
        auVar160._28_36_ = auVar222._28_36_;
        fVar95 = auVar131._24_4_;
        auVar160._24_4_ = fVar95 * fStack_6a8;
        auVar159._0_4_ = fVar190 * (float)local_6e0._0_4_;
        auVar159._4_4_ = fVar227 * (float)local_6e0._4_4_;
        auVar159._8_4_ = fVar228 * fStack_6d8;
        auVar159._12_4_ = fVar184 * fStack_6d4;
        auVar159._16_4_ = fVar189 * fStack_6d0;
        auVar159._20_4_ = fVar198 * fStack_6cc;
        auVar159._28_36_ = auVar219._28_36_;
        auVar159._24_4_ = fVar95 * fStack_6c8;
        auVar119 = vmulps_avx512vl(local_400,auVar131);
        auVar120 = vfmadd231ps_avx512vl(auVar160._0_32_,auVar132,local_680);
        auVar130 = vfmadd231ps_avx512vl(auVar159._0_32_,auVar132,local_6a0);
        auVar119 = vfmadd231ps_avx512vl(auVar119,auVar132,local_3e0);
        auVar120 = vfmadd231ps_avx512vl(auVar120,auVar134,local_640);
        auVar130 = vfmadd231ps_avx512vl(auVar130,auVar134,local_660);
        auVar129 = vfmadd231ps_avx512vl(auVar119,auVar134,local_3c0);
        auVar110 = vfmadd231ps_fma(auVar120,auVar133,local_600);
        auVar222 = ZEXT1664(auVar110);
        auVar113 = vfmadd231ps_fma(auVar130,auVar133,local_620);
        auVar219 = ZEXT1664(auVar113);
        auVar119 = *(undefined1 (*) [32])(bspline_basis1 + lVar89 * 4 + lVar92);
        auVar120 = *(undefined1 (*) [32])(lVar92 + 0x22023cc + lVar89 * 4);
        auVar122 = vfmadd231ps_avx512vl(auVar129,auVar133,local_3a0);
        auVar130 = *(undefined1 (*) [32])(lVar92 + 0x2202850 + lVar89 * 4);
        auVar129 = *(undefined1 (*) [32])(lVar92 + 0x2202cd4 + lVar89 * 4);
        fVar96 = auVar129._0_4_;
        auVar225._0_4_ = fVar96 * (float)local_6c0._0_4_;
        fVar161 = auVar129._4_4_;
        auVar225._4_4_ = fVar161 * (float)local_6c0._4_4_;
        fVar162 = auVar129._8_4_;
        auVar225._8_4_ = fVar162 * fStack_6b8;
        fVar163 = auVar129._12_4_;
        auVar225._12_4_ = fVar163 * fStack_6b4;
        fVar164 = auVar129._16_4_;
        auVar225._16_4_ = fVar164 * fStack_6b0;
        fVar166 = auVar129._20_4_;
        auVar225._20_4_ = fVar166 * fStack_6ac;
        auVar225._28_36_ = auVar224._28_36_;
        fVar167 = auVar129._24_4_;
        auVar225._24_4_ = fVar167 * fStack_6a8;
        auVar48._4_4_ = fVar161 * (float)local_6e0._4_4_;
        auVar48._0_4_ = fVar96 * (float)local_6e0._0_4_;
        auVar48._8_4_ = fVar162 * fStack_6d8;
        auVar48._12_4_ = fVar163 * fStack_6d4;
        auVar48._16_4_ = fVar164 * fStack_6d0;
        auVar48._20_4_ = fVar166 * fStack_6cc;
        auVar48._24_4_ = fVar167 * fStack_6c8;
        auVar48._28_4_ = uStack_6c4;
        auVar121 = vmulps_avx512vl(local_400,auVar129);
        auVar123 = vfmadd231ps_avx512vl(auVar225._0_32_,auVar130,local_680);
        auVar124 = vfmadd231ps_avx512vl(auVar48,auVar130,local_6a0);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar130,local_3e0);
        auVar123 = vfmadd231ps_avx512vl(auVar123,auVar120,local_640);
        auVar124 = vfmadd231ps_avx512vl(auVar124,auVar120,local_660);
        auVar121 = vfmadd231ps_avx512vl(auVar121,auVar120,local_3c0);
        auVar112 = vfmadd231ps_fma(auVar123,auVar119,local_600);
        auVar224 = ZEXT1664(auVar112);
        auVar106 = vfmadd231ps_fma(auVar124,auVar119,local_620);
        auVar123 = vfmadd231ps_avx512vl(auVar121,auVar119,local_3a0);
        auVar124 = vmaxps_avx512vl(auVar122,auVar123);
        auVar121 = vsubps_avx(ZEXT1632(auVar112),ZEXT1632(auVar110));
        auVar125 = vsubps_avx512vl(ZEXT1632(auVar106),ZEXT1632(auVar113));
        auVar126 = vmulps_avx512vl(ZEXT1632(auVar113),auVar121);
        auVar127 = vmulps_avx512vl(ZEXT1632(auVar110),auVar125);
        auVar126 = vsubps_avx512vl(auVar126,auVar127);
        auVar127 = vmulps_avx512vl(auVar125,auVar125);
        auVar127 = vfmadd231ps_avx512vl(auVar127,auVar121,auVar121);
        auVar124 = vmulps_avx512vl(auVar124,auVar124);
        auVar124 = vmulps_avx512vl(auVar124,auVar127);
        auVar126 = vmulps_avx512vl(auVar126,auVar126);
        uVar185 = vcmpps_avx512vl(auVar126,auVar124,2);
        bVar93 = (byte)uVar29 & (byte)uVar185;
        if (bVar93 != 0) {
          fVar165 = local_4a0._0_4_;
          fVar168 = local_4a0._4_4_;
          auVar49._4_4_ = fVar168 * fVar161;
          auVar49._0_4_ = fVar165 * fVar96;
          fVar96 = local_4a0._8_4_;
          auVar49._8_4_ = fVar96 * fVar162;
          fVar161 = local_4a0._12_4_;
          auVar49._12_4_ = fVar161 * fVar163;
          fVar162 = local_4a0._16_4_;
          auVar49._16_4_ = fVar162 * fVar164;
          fVar163 = local_4a0._20_4_;
          auVar49._20_4_ = fVar163 * fVar166;
          fVar164 = local_4a0._24_4_;
          auVar49._24_4_ = fVar164 * fVar167;
          auVar49._28_4_ = auVar129._28_4_;
          auVar130 = vfmadd213ps_avx512vl(auVar130,local_480,auVar49);
          auVar120 = vfmadd213ps_avx512vl(auVar120,local_460,auVar130);
          auVar119 = vfmadd213ps_avx512vl(auVar119,local_440,auVar120);
          auVar50._4_4_ = fVar168 * fVar227;
          auVar50._0_4_ = fVar165 * fVar190;
          auVar50._8_4_ = fVar96 * fVar228;
          auVar50._12_4_ = fVar161 * fVar184;
          auVar50._16_4_ = fVar162 * fVar189;
          auVar50._20_4_ = fVar163 * fVar198;
          auVar50._24_4_ = fVar164 * fVar95;
          auVar50._28_4_ = auVar131._28_4_;
          auVar132 = vfmadd213ps_avx512vl(auVar132,local_480,auVar50);
          auVar134 = vfmadd213ps_avx512vl(auVar134,local_460,auVar132);
          auVar120 = vfmadd213ps_avx512vl(auVar133,local_440,auVar134);
          auVar133 = *(undefined1 (*) [32])(lVar92 + 0x2200d38 + lVar89 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar92 + 0x22011bc + lVar89 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar92 + 0x2201640 + lVar89 * 4);
          auVar131 = *(undefined1 (*) [32])(lVar92 + 0x2201ac4 + lVar89 * 4);
          auVar130 = vmulps_avx512vl(_local_6c0,auVar131);
          auVar129 = vmulps_avx512vl(_local_6e0,auVar131);
          auVar51._4_4_ = fVar168 * auVar131._4_4_;
          auVar51._0_4_ = fVar165 * auVar131._0_4_;
          auVar51._8_4_ = fVar96 * auVar131._8_4_;
          auVar51._12_4_ = fVar161 * auVar131._12_4_;
          auVar51._16_4_ = fVar162 * auVar131._16_4_;
          auVar51._20_4_ = fVar163 * auVar131._20_4_;
          auVar51._24_4_ = fVar164 * auVar131._24_4_;
          auVar51._28_4_ = auVar131._28_4_;
          auVar131 = vfmadd231ps_avx512vl(auVar130,auVar132,local_680);
          auVar130 = vfmadd231ps_avx512vl(auVar129,auVar132,local_6a0);
          auVar132 = vfmadd231ps_avx512vl(auVar51,local_480,auVar132);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar134,local_640);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar134,local_660);
          auVar134 = vfmadd231ps_avx512vl(auVar132,local_460,auVar134);
          auVar131 = vfmadd231ps_avx512vl(auVar131,auVar133,local_600);
          auVar130 = vfmadd231ps_avx512vl(auVar130,auVar133,local_620);
          auVar129 = vfmadd231ps_avx512vl(auVar134,local_440,auVar133);
          auVar133 = *(undefined1 (*) [32])(lVar92 + 0x2203158 + lVar89 * 4);
          auVar134 = *(undefined1 (*) [32])(lVar92 + 0x2203a60 + lVar89 * 4);
          auVar132 = *(undefined1 (*) [32])(lVar92 + 0x2203ee4 + lVar89 * 4);
          auVar124 = vmulps_avx512vl(_local_6c0,auVar132);
          auVar126 = vmulps_avx512vl(_local_6e0,auVar132);
          auVar132 = vmulps_avx512vl(local_4a0,auVar132);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar134,local_680);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar134,local_6a0);
          auVar132 = vfmadd231ps_avx512vl(auVar132,local_480,auVar134);
          auVar243 = ZEXT1664(auVar243._0_16_);
          auVar134 = *(undefined1 (*) [32])(lVar92 + 0x22035dc + lVar89 * 4);
          auVar124 = vfmadd231ps_avx512vl(auVar124,auVar134,local_640);
          auVar126 = vfmadd231ps_avx512vl(auVar126,auVar134,local_660);
          auVar134 = vfmadd231ps_avx512vl(auVar132,local_460,auVar134);
          auVar182 = ZEXT1664(auVar182._0_16_);
          auVar132 = vfmadd231ps_avx512vl(auVar124,auVar133,local_600);
          auVar124 = vfmadd231ps_avx512vl(auVar126,auVar133,local_620);
          auVar134 = vfmadd231ps_avx512vl(auVar134,local_440,auVar133);
          auVar126 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
          vandps_avx512vl(auVar131,auVar126);
          vandps_avx512vl(auVar130,auVar126);
          auVar133 = vmaxps_avx(auVar126,auVar126);
          vandps_avx512vl(auVar129,auVar126);
          auVar133 = vmaxps_avx(auVar133,auVar126);
          uVar88 = vcmpps_avx512vl(auVar133,local_7a0,1);
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar146._0_4_ = (float)((uint)bVar12 * auVar121._0_4_ | (uint)!bVar12 * auVar131._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar146._4_4_ = (float)((uint)bVar12 * auVar121._4_4_ | (uint)!bVar12 * auVar131._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar146._8_4_ = (float)((uint)bVar12 * auVar121._8_4_ | (uint)!bVar12 * auVar131._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar146._12_4_ =
               (float)((uint)bVar12 * auVar121._12_4_ | (uint)!bVar12 * auVar131._12_4_);
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar146._16_4_ =
               (float)((uint)bVar12 * auVar121._16_4_ | (uint)!bVar12 * auVar131._16_4_);
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar146._20_4_ =
               (float)((uint)bVar12 * auVar121._20_4_ | (uint)!bVar12 * auVar131._20_4_);
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar146._24_4_ =
               (float)((uint)bVar12 * auVar121._24_4_ | (uint)!bVar12 * auVar131._24_4_);
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar146._28_4_ = (uint)bVar12 * auVar121._28_4_ | (uint)!bVar12 * auVar131._28_4_;
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar147._0_4_ = (float)((uint)bVar12 * auVar125._0_4_ | (uint)!bVar12 * auVar130._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar147._4_4_ = (float)((uint)bVar12 * auVar125._4_4_ | (uint)!bVar12 * auVar130._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar147._8_4_ = (float)((uint)bVar12 * auVar125._8_4_ | (uint)!bVar12 * auVar130._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar147._12_4_ =
               (float)((uint)bVar12 * auVar125._12_4_ | (uint)!bVar12 * auVar130._12_4_);
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar147._16_4_ =
               (float)((uint)bVar12 * auVar125._16_4_ | (uint)!bVar12 * auVar130._16_4_);
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar147._20_4_ =
               (float)((uint)bVar12 * auVar125._20_4_ | (uint)!bVar12 * auVar130._20_4_);
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar147._24_4_ =
               (float)((uint)bVar12 * auVar125._24_4_ | (uint)!bVar12 * auVar130._24_4_);
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar147._28_4_ = (uint)bVar12 * auVar125._28_4_ | (uint)!bVar12 * auVar130._28_4_;
          vandps_avx512vl(auVar132,auVar126);
          vandps_avx512vl(auVar124,auVar126);
          auVar133 = vmaxps_avx(auVar147,auVar147);
          vandps_avx512vl(auVar134,auVar126);
          auVar133 = vmaxps_avx(auVar133,auVar147);
          uVar88 = vcmpps_avx512vl(auVar133,local_7a0,1);
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar148._0_4_ = (uint)bVar12 * auVar121._0_4_ | (uint)!bVar12 * auVar132._0_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar148._4_4_ = (uint)bVar12 * auVar121._4_4_ | (uint)!bVar12 * auVar132._4_4_;
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar148._8_4_ = (uint)bVar12 * auVar121._8_4_ | (uint)!bVar12 * auVar132._8_4_;
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar148._12_4_ = (uint)bVar12 * auVar121._12_4_ | (uint)!bVar12 * auVar132._12_4_;
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar148._16_4_ = (uint)bVar12 * auVar121._16_4_ | (uint)!bVar12 * auVar132._16_4_;
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar148._20_4_ = (uint)bVar12 * auVar121._20_4_ | (uint)!bVar12 * auVar132._20_4_;
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar148._24_4_ = (uint)bVar12 * auVar121._24_4_ | (uint)!bVar12 * auVar132._24_4_;
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar148._28_4_ = (uint)bVar12 * auVar121._28_4_ | (uint)!bVar12 * auVar132._28_4_;
          bVar12 = (bool)((byte)uVar88 & 1);
          auVar149._0_4_ = (float)((uint)bVar12 * auVar125._0_4_ | (uint)!bVar12 * auVar124._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar149._4_4_ = (float)((uint)bVar12 * auVar125._4_4_ | (uint)!bVar12 * auVar124._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar149._8_4_ = (float)((uint)bVar12 * auVar125._8_4_ | (uint)!bVar12 * auVar124._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar149._12_4_ =
               (float)((uint)bVar12 * auVar125._12_4_ | (uint)!bVar12 * auVar124._12_4_);
          bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
          auVar149._16_4_ =
               (float)((uint)bVar12 * auVar125._16_4_ | (uint)!bVar12 * auVar124._16_4_);
          bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
          auVar149._20_4_ =
               (float)((uint)bVar12 * auVar125._20_4_ | (uint)!bVar12 * auVar124._20_4_);
          bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
          auVar149._24_4_ =
               (float)((uint)bVar12 * auVar125._24_4_ | (uint)!bVar12 * auVar124._24_4_);
          bVar12 = SUB81(uVar88 >> 7,0);
          auVar149._28_4_ = (uint)bVar12 * auVar125._28_4_ | (uint)!bVar12 * auVar124._28_4_;
          auVar230._8_4_ = 0x80000000;
          auVar230._0_8_ = 0x8000000080000000;
          auVar230._12_4_ = 0x80000000;
          auVar230._16_4_ = 0x80000000;
          auVar230._20_4_ = 0x80000000;
          auVar230._24_4_ = 0x80000000;
          auVar230._28_4_ = 0x80000000;
          auVar133 = vxorps_avx512vl(auVar148,auVar230);
          auVar118 = vxorps_avx512vl(auVar126._0_16_,auVar126._0_16_);
          auVar134 = vfmadd213ps_avx512vl(auVar146,auVar146,ZEXT1632(auVar118));
          auVar102 = vfmadd231ps_fma(auVar134,auVar147,auVar147);
          auVar134 = vrsqrt14ps_avx512vl(ZEXT1632(auVar102));
          auVar241._8_4_ = 0xbf000000;
          auVar241._0_8_ = 0xbf000000bf000000;
          auVar241._12_4_ = 0xbf000000;
          auVar241._16_4_ = 0xbf000000;
          auVar241._20_4_ = 0xbf000000;
          auVar241._24_4_ = 0xbf000000;
          auVar241._28_4_ = 0xbf000000;
          fVar190 = auVar134._0_4_;
          fVar227 = auVar134._4_4_;
          fVar228 = auVar134._8_4_;
          fVar184 = auVar134._12_4_;
          fVar189 = auVar134._16_4_;
          fVar198 = auVar134._20_4_;
          fVar95 = auVar134._24_4_;
          auVar52._4_4_ = fVar227 * fVar227 * fVar227 * auVar102._4_4_ * -0.5;
          auVar52._0_4_ = fVar190 * fVar190 * fVar190 * auVar102._0_4_ * -0.5;
          auVar52._8_4_ = fVar228 * fVar228 * fVar228 * auVar102._8_4_ * -0.5;
          auVar52._12_4_ = fVar184 * fVar184 * fVar184 * auVar102._12_4_ * -0.5;
          auVar52._16_4_ = fVar189 * fVar189 * fVar189 * -0.0;
          auVar52._20_4_ = fVar198 * fVar198 * fVar198 * -0.0;
          auVar52._24_4_ = fVar95 * fVar95 * fVar95 * -0.0;
          auVar52._28_4_ = auVar147._28_4_;
          auVar132 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
          auVar134 = vfmadd231ps_avx512vl(auVar52,auVar132,auVar134);
          auVar53._4_4_ = auVar147._4_4_ * auVar134._4_4_;
          auVar53._0_4_ = auVar147._0_4_ * auVar134._0_4_;
          auVar53._8_4_ = auVar147._8_4_ * auVar134._8_4_;
          auVar53._12_4_ = auVar147._12_4_ * auVar134._12_4_;
          auVar53._16_4_ = auVar147._16_4_ * auVar134._16_4_;
          auVar53._20_4_ = auVar147._20_4_ * auVar134._20_4_;
          auVar53._24_4_ = auVar147._24_4_ * auVar134._24_4_;
          auVar53._28_4_ = 0;
          auVar54._4_4_ = auVar134._4_4_ * -auVar146._4_4_;
          auVar54._0_4_ = auVar134._0_4_ * -auVar146._0_4_;
          auVar54._8_4_ = auVar134._8_4_ * -auVar146._8_4_;
          auVar54._12_4_ = auVar134._12_4_ * -auVar146._12_4_;
          auVar54._16_4_ = auVar134._16_4_ * -auVar146._16_4_;
          auVar54._20_4_ = auVar134._20_4_ * -auVar146._20_4_;
          auVar54._24_4_ = auVar134._24_4_ * -auVar146._24_4_;
          auVar54._28_4_ = auVar147._28_4_;
          auVar131 = vmulps_avx512vl(auVar134,ZEXT1632(auVar118));
          auVar129 = ZEXT1632(auVar118);
          auVar134 = vfmadd213ps_avx512vl(auVar148,auVar148,auVar129);
          auVar134 = vfmadd231ps_avx512vl(auVar134,auVar149,auVar149);
          auVar130 = vrsqrt14ps_avx512vl(auVar134);
          auVar134 = vmulps_avx512vl(auVar134,auVar241);
          fVar190 = auVar130._0_4_;
          fVar227 = auVar130._4_4_;
          fVar228 = auVar130._8_4_;
          fVar184 = auVar130._12_4_;
          fVar189 = auVar130._16_4_;
          fVar198 = auVar130._20_4_;
          fVar95 = auVar130._24_4_;
          auVar55._4_4_ = fVar227 * fVar227 * fVar227 * auVar134._4_4_;
          auVar55._0_4_ = fVar190 * fVar190 * fVar190 * auVar134._0_4_;
          auVar55._8_4_ = fVar228 * fVar228 * fVar228 * auVar134._8_4_;
          auVar55._12_4_ = fVar184 * fVar184 * fVar184 * auVar134._12_4_;
          auVar55._16_4_ = fVar189 * fVar189 * fVar189 * auVar134._16_4_;
          auVar55._20_4_ = fVar198 * fVar198 * fVar198 * auVar134._20_4_;
          auVar55._24_4_ = fVar95 * fVar95 * fVar95 * auVar134._24_4_;
          auVar55._28_4_ = auVar134._28_4_;
          auVar134 = vfmadd231ps_avx512vl(auVar55,auVar132,auVar130);
          auVar56._4_4_ = auVar149._4_4_ * auVar134._4_4_;
          auVar56._0_4_ = auVar149._0_4_ * auVar134._0_4_;
          auVar56._8_4_ = auVar149._8_4_ * auVar134._8_4_;
          auVar56._12_4_ = auVar149._12_4_ * auVar134._12_4_;
          auVar56._16_4_ = auVar149._16_4_ * auVar134._16_4_;
          auVar56._20_4_ = auVar149._20_4_ * auVar134._20_4_;
          auVar56._24_4_ = auVar149._24_4_ * auVar134._24_4_;
          auVar56._28_4_ = auVar130._28_4_;
          auVar57._4_4_ = auVar134._4_4_ * auVar133._4_4_;
          auVar57._0_4_ = auVar134._0_4_ * auVar133._0_4_;
          auVar57._8_4_ = auVar134._8_4_ * auVar133._8_4_;
          auVar57._12_4_ = auVar134._12_4_ * auVar133._12_4_;
          auVar57._16_4_ = auVar134._16_4_ * auVar133._16_4_;
          auVar57._20_4_ = auVar134._20_4_ * auVar133._20_4_;
          auVar57._24_4_ = auVar134._24_4_ * auVar133._24_4_;
          auVar57._28_4_ = auVar133._28_4_;
          auVar133 = vmulps_avx512vl(auVar134,auVar129);
          auVar102 = vfmadd213ps_fma(auVar53,auVar122,ZEXT1632(auVar110));
          auVar103 = vfmadd213ps_fma(auVar54,auVar122,ZEXT1632(auVar113));
          auVar132 = vfmadd213ps_avx512vl(auVar131,auVar122,auVar120);
          auVar130 = vfmadd213ps_avx512vl(auVar56,auVar123,ZEXT1632(auVar112));
          auVar105 = vfnmadd213ps_fma(auVar53,auVar122,ZEXT1632(auVar110));
          auVar110 = vfmadd213ps_fma(auVar57,auVar123,ZEXT1632(auVar106));
          auVar107 = vfnmadd213ps_fma(auVar54,auVar122,ZEXT1632(auVar113));
          auVar113 = vfmadd213ps_fma(auVar133,auVar123,auVar119);
          auVar242 = vfnmadd231ps_fma(auVar120,auVar122,auVar131);
          auVar109 = vfnmadd213ps_fma(auVar56,auVar123,ZEXT1632(auVar112));
          auVar116 = vfnmadd213ps_fma(auVar57,auVar123,ZEXT1632(auVar106));
          auVar117 = vfnmadd231ps_fma(auVar119,auVar123,auVar133);
          auVar119 = vsubps_avx512vl(auVar130,ZEXT1632(auVar105));
          auVar133 = vsubps_avx(ZEXT1632(auVar110),ZEXT1632(auVar107));
          auVar134 = vsubps_avx(ZEXT1632(auVar113),ZEXT1632(auVar242));
          auVar58._4_4_ = auVar133._4_4_ * auVar242._4_4_;
          auVar58._0_4_ = auVar133._0_4_ * auVar242._0_4_;
          auVar58._8_4_ = auVar133._8_4_ * auVar242._8_4_;
          auVar58._12_4_ = auVar133._12_4_ * auVar242._12_4_;
          auVar58._16_4_ = auVar133._16_4_ * 0.0;
          auVar58._20_4_ = auVar133._20_4_ * 0.0;
          auVar58._24_4_ = auVar133._24_4_ * 0.0;
          auVar58._28_4_ = auVar131._28_4_;
          auVar112 = vfmsub231ps_fma(auVar58,ZEXT1632(auVar107),auVar134);
          auVar59._4_4_ = auVar134._4_4_ * auVar105._4_4_;
          auVar59._0_4_ = auVar134._0_4_ * auVar105._0_4_;
          auVar59._8_4_ = auVar134._8_4_ * auVar105._8_4_;
          auVar59._12_4_ = auVar134._12_4_ * auVar105._12_4_;
          auVar59._16_4_ = auVar134._16_4_ * 0.0;
          auVar59._20_4_ = auVar134._20_4_ * 0.0;
          auVar59._24_4_ = auVar134._24_4_ * 0.0;
          auVar59._28_4_ = auVar134._28_4_;
          auVar106 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar242),auVar119);
          auVar60._4_4_ = auVar107._4_4_ * auVar119._4_4_;
          auVar60._0_4_ = auVar107._0_4_ * auVar119._0_4_;
          auVar60._8_4_ = auVar107._8_4_ * auVar119._8_4_;
          auVar60._12_4_ = auVar107._12_4_ * auVar119._12_4_;
          auVar60._16_4_ = auVar119._16_4_ * 0.0;
          auVar60._20_4_ = auVar119._20_4_ * 0.0;
          auVar60._24_4_ = auVar119._24_4_ * 0.0;
          auVar60._28_4_ = auVar119._28_4_;
          auVar104 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar105),auVar133);
          auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar104),auVar129,ZEXT1632(auVar106));
          auVar133 = vfmadd231ps_avx512vl(auVar133,auVar129,ZEXT1632(auVar112));
          auVar126 = ZEXT1632(auVar118);
          uVar88 = vcmpps_avx512vl(auVar133,auVar126,2);
          bVar85 = (byte)uVar88;
          fVar162 = (float)((uint)(bVar85 & 1) * auVar102._0_4_ |
                           (uint)!(bool)(bVar85 & 1) * auVar109._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          fVar164 = (float)((uint)bVar12 * auVar102._4_4_ | (uint)!bVar12 * auVar109._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          fVar167 = (float)((uint)bVar12 * auVar102._8_4_ | (uint)!bVar12 * auVar109._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          fVar168 = (float)((uint)bVar12 * auVar102._12_4_ | (uint)!bVar12 * auVar109._12_4_);
          auVar129 = ZEXT1632(CONCAT412(fVar168,CONCAT48(fVar167,CONCAT44(fVar164,fVar162))));
          fVar163 = (float)((uint)(bVar85 & 1) * auVar103._0_4_ |
                           (uint)!(bool)(bVar85 & 1) * auVar116._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          fVar166 = (float)((uint)bVar12 * auVar103._4_4_ | (uint)!bVar12 * auVar116._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          fVar165 = (float)((uint)bVar12 * auVar103._8_4_ | (uint)!bVar12 * auVar116._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          fVar169 = (float)((uint)bVar12 * auVar103._12_4_ | (uint)!bVar12 * auVar116._12_4_);
          auVar121 = ZEXT1632(CONCAT412(fVar169,CONCAT48(fVar165,CONCAT44(fVar166,fVar163))));
          auVar150._0_4_ =
               (float)((uint)(bVar85 & 1) * auVar132._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar117._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar150._4_4_ = (float)((uint)bVar12 * auVar132._4_4_ | (uint)!bVar12 * auVar117._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar150._8_4_ = (float)((uint)bVar12 * auVar132._8_4_ | (uint)!bVar12 * auVar117._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar150._12_4_ =
               (float)((uint)bVar12 * auVar132._12_4_ | (uint)!bVar12 * auVar117._12_4_);
          fVar190 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar132._16_4_);
          auVar150._16_4_ = fVar190;
          fVar227 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar132._20_4_);
          auVar150._20_4_ = fVar227;
          fVar228 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar132._24_4_);
          auVar150._24_4_ = fVar228;
          iVar1 = (uint)(byte)(uVar88 >> 7) * auVar132._28_4_;
          auVar150._28_4_ = iVar1;
          auVar133 = vblendmps_avx512vl(ZEXT1632(auVar105),auVar130);
          auVar151._0_4_ =
               (uint)(bVar85 & 1) * auVar133._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar112._0_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar151._4_4_ = (uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * auVar112._4_4_;
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar151._8_4_ = (uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * auVar112._8_4_;
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar151._12_4_ = (uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * auVar112._12_4_;
          auVar151._16_4_ = (uint)((byte)(uVar88 >> 4) & 1) * auVar133._16_4_;
          auVar151._20_4_ = (uint)((byte)(uVar88 >> 5) & 1) * auVar133._20_4_;
          auVar151._24_4_ = (uint)((byte)(uVar88 >> 6) & 1) * auVar133._24_4_;
          auVar151._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar133._28_4_;
          auVar133 = vblendmps_avx512vl(ZEXT1632(auVar107),ZEXT1632(auVar110));
          auVar152._0_4_ =
               (float)((uint)(bVar85 & 1) * auVar133._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar102._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar152._4_4_ = (float)((uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * auVar102._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar152._8_4_ = (float)((uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * auVar102._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar152._12_4_ =
               (float)((uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * auVar102._12_4_);
          fVar198 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar133._16_4_);
          auVar152._16_4_ = fVar198;
          fVar184 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar133._20_4_);
          auVar152._20_4_ = fVar184;
          fVar189 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar133._24_4_);
          auVar152._24_4_ = fVar189;
          auVar152._28_4_ = (uint)(byte)(uVar88 >> 7) * auVar133._28_4_;
          auVar133 = vblendmps_avx512vl(ZEXT1632(auVar242),ZEXT1632(auVar113));
          auVar153._0_4_ =
               (float)((uint)(bVar85 & 1) * auVar133._0_4_ |
                      (uint)!(bool)(bVar85 & 1) * auVar103._0_4_);
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar153._4_4_ = (float)((uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * auVar103._4_4_);
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar153._8_4_ = (float)((uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * auVar103._8_4_);
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar153._12_4_ =
               (float)((uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * auVar103._12_4_);
          fVar95 = (float)((uint)((byte)(uVar88 >> 4) & 1) * auVar133._16_4_);
          auVar153._16_4_ = fVar95;
          fVar96 = (float)((uint)((byte)(uVar88 >> 5) & 1) * auVar133._20_4_);
          auVar153._20_4_ = fVar96;
          fVar161 = (float)((uint)((byte)(uVar88 >> 6) & 1) * auVar133._24_4_);
          auVar153._24_4_ = fVar161;
          iVar2 = (uint)(byte)(uVar88 >> 7) * auVar133._28_4_;
          auVar153._28_4_ = iVar2;
          auVar154._0_4_ =
               (uint)(bVar85 & 1) * (int)auVar105._0_4_ | (uint)!(bool)(bVar85 & 1) * auVar130._0_4_
          ;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          auVar154._4_4_ = (uint)bVar12 * (int)auVar105._4_4_ | (uint)!bVar12 * auVar130._4_4_;
          bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
          auVar154._8_4_ = (uint)bVar12 * (int)auVar105._8_4_ | (uint)!bVar12 * auVar130._8_4_;
          bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar154._12_4_ = (uint)bVar12 * (int)auVar105._12_4_ | (uint)!bVar12 * auVar130._12_4_;
          auVar154._16_4_ = (uint)!(bool)((byte)(uVar88 >> 4) & 1) * auVar130._16_4_;
          auVar154._20_4_ = (uint)!(bool)((byte)(uVar88 >> 5) & 1) * auVar130._20_4_;
          auVar154._24_4_ = (uint)!(bool)((byte)(uVar88 >> 6) & 1) * auVar130._24_4_;
          auVar154._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar130._28_4_;
          bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar88 >> 2) & 1);
          bVar16 = (bool)((byte)(uVar88 >> 3) & 1);
          bVar13 = (bool)((byte)(uVar88 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar88 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar88 >> 3) & 1);
          auVar130 = vsubps_avx512vl(auVar154,auVar129);
          auVar134 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar107._12_4_ |
                                                   (uint)!bVar16 * auVar110._12_4_,
                                                   CONCAT48((uint)bVar14 * (int)auVar107._8_4_ |
                                                            (uint)!bVar14 * auVar110._8_4_,
                                                            CONCAT44((uint)bVar12 *
                                                                     (int)auVar107._4_4_ |
                                                                     (uint)!bVar12 * auVar110._4_4_,
                                                                     (uint)(bVar85 & 1) *
                                                                     (int)auVar107._0_4_ |
                                                                     (uint)!(bool)(bVar85 & 1) *
                                                                     auVar110._0_4_)))),auVar121);
          auVar222 = ZEXT3264(auVar134);
          auVar132 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar242._12_4_ |
                                                   (uint)!bVar17 * auVar113._12_4_,
                                                   CONCAT48((uint)bVar15 * (int)auVar242._8_4_ |
                                                            (uint)!bVar15 * auVar113._8_4_,
                                                            CONCAT44((uint)bVar13 *
                                                                     (int)auVar242._4_4_ |
                                                                     (uint)!bVar13 * auVar113._4_4_,
                                                                     (uint)(bVar85 & 1) *
                                                                     (int)auVar242._0_4_ |
                                                                     (uint)!(bool)(bVar85 & 1) *
                                                                     auVar113._0_4_)))),auVar150);
          auVar131 = vsubps_avx(auVar129,auVar151);
          auVar224 = ZEXT3264(auVar131);
          auVar119 = vsubps_avx(auVar121,auVar152);
          auVar120 = vsubps_avx(auVar150,auVar153);
          auVar61._4_4_ = auVar132._4_4_ * fVar164;
          auVar61._0_4_ = auVar132._0_4_ * fVar162;
          auVar61._8_4_ = auVar132._8_4_ * fVar167;
          auVar61._12_4_ = auVar132._12_4_ * fVar168;
          auVar61._16_4_ = auVar132._16_4_ * 0.0;
          auVar61._20_4_ = auVar132._20_4_ * 0.0;
          auVar61._24_4_ = auVar132._24_4_ * 0.0;
          auVar61._28_4_ = 0;
          auVar110 = vfmsub231ps_fma(auVar61,auVar150,auVar130);
          auVar205._0_4_ = fVar163 * auVar130._0_4_;
          auVar205._4_4_ = fVar166 * auVar130._4_4_;
          auVar205._8_4_ = fVar165 * auVar130._8_4_;
          auVar205._12_4_ = fVar169 * auVar130._12_4_;
          auVar205._16_4_ = auVar130._16_4_ * 0.0;
          auVar205._20_4_ = auVar130._20_4_ * 0.0;
          auVar205._24_4_ = auVar130._24_4_ * 0.0;
          auVar205._28_4_ = 0;
          auVar113 = vfmsub231ps_fma(auVar205,auVar129,auVar134);
          auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar126,ZEXT1632(auVar110));
          auVar217._0_4_ = auVar134._0_4_ * auVar150._0_4_;
          auVar217._4_4_ = auVar134._4_4_ * auVar150._4_4_;
          auVar217._8_4_ = auVar134._8_4_ * auVar150._8_4_;
          auVar217._12_4_ = auVar134._12_4_ * auVar150._12_4_;
          auVar217._16_4_ = auVar134._16_4_ * fVar190;
          auVar217._20_4_ = auVar134._20_4_ * fVar227;
          auVar217._24_4_ = auVar134._24_4_ * fVar228;
          auVar217._28_4_ = 0;
          auVar110 = vfmsub231ps_fma(auVar217,auVar121,auVar132);
          auVar124 = vfmadd231ps_avx512vl(auVar133,auVar126,ZEXT1632(auVar110));
          auVar133 = vmulps_avx512vl(auVar120,auVar151);
          auVar133 = vfmsub231ps_avx512vl(auVar133,auVar131,auVar153);
          auVar62._4_4_ = auVar119._4_4_ * auVar153._4_4_;
          auVar62._0_4_ = auVar119._0_4_ * auVar153._0_4_;
          auVar62._8_4_ = auVar119._8_4_ * auVar153._8_4_;
          auVar62._12_4_ = auVar119._12_4_ * auVar153._12_4_;
          auVar62._16_4_ = auVar119._16_4_ * fVar95;
          auVar62._20_4_ = auVar119._20_4_ * fVar96;
          auVar62._24_4_ = auVar119._24_4_ * fVar161;
          auVar62._28_4_ = iVar2;
          auVar110 = vfmsub231ps_fma(auVar62,auVar152,auVar120);
          auVar218._0_4_ = auVar152._0_4_ * auVar131._0_4_;
          auVar218._4_4_ = auVar152._4_4_ * auVar131._4_4_;
          auVar218._8_4_ = auVar152._8_4_ * auVar131._8_4_;
          auVar218._12_4_ = auVar152._12_4_ * auVar131._12_4_;
          auVar218._16_4_ = fVar198 * auVar131._16_4_;
          auVar218._20_4_ = fVar184 * auVar131._20_4_;
          auVar218._24_4_ = fVar189 * auVar131._24_4_;
          auVar218._28_4_ = 0;
          auVar113 = vfmsub231ps_fma(auVar218,auVar119,auVar151);
          auVar133 = vfmadd231ps_avx512vl(ZEXT1632(auVar113),auVar126,auVar133);
          auVar125 = vfmadd231ps_avx512vl(auVar133,auVar126,ZEXT1632(auVar110));
          auVar219 = ZEXT3264(auVar125);
          auVar133 = vmaxps_avx(auVar124,auVar125);
          uVar185 = vcmpps_avx512vl(auVar133,auVar126,2);
          bVar93 = bVar93 & (byte)uVar185;
          if (bVar93 != 0) {
            auVar63._4_4_ = auVar120._4_4_ * auVar134._4_4_;
            auVar63._0_4_ = auVar120._0_4_ * auVar134._0_4_;
            auVar63._8_4_ = auVar120._8_4_ * auVar134._8_4_;
            auVar63._12_4_ = auVar120._12_4_ * auVar134._12_4_;
            auVar63._16_4_ = auVar120._16_4_ * auVar134._16_4_;
            auVar63._20_4_ = auVar120._20_4_ * auVar134._20_4_;
            auVar63._24_4_ = auVar120._24_4_ * auVar134._24_4_;
            auVar63._28_4_ = auVar133._28_4_;
            auVar106 = vfmsub231ps_fma(auVar63,auVar119,auVar132);
            auVar64._4_4_ = auVar132._4_4_ * auVar131._4_4_;
            auVar64._0_4_ = auVar132._0_4_ * auVar131._0_4_;
            auVar64._8_4_ = auVar132._8_4_ * auVar131._8_4_;
            auVar64._12_4_ = auVar132._12_4_ * auVar131._12_4_;
            auVar64._16_4_ = auVar132._16_4_ * auVar131._16_4_;
            auVar64._20_4_ = auVar132._20_4_ * auVar131._20_4_;
            auVar64._24_4_ = auVar132._24_4_ * auVar131._24_4_;
            auVar64._28_4_ = auVar132._28_4_;
            auVar112 = vfmsub231ps_fma(auVar64,auVar130,auVar120);
            auVar65._4_4_ = auVar119._4_4_ * auVar130._4_4_;
            auVar65._0_4_ = auVar119._0_4_ * auVar130._0_4_;
            auVar65._8_4_ = auVar119._8_4_ * auVar130._8_4_;
            auVar65._12_4_ = auVar119._12_4_ * auVar130._12_4_;
            auVar65._16_4_ = auVar119._16_4_ * auVar130._16_4_;
            auVar65._20_4_ = auVar119._20_4_ * auVar130._20_4_;
            auVar65._24_4_ = auVar119._24_4_ * auVar130._24_4_;
            auVar65._28_4_ = auVar119._28_4_;
            auVar102 = vfmsub231ps_fma(auVar65,auVar131,auVar134);
            auVar110 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar112),ZEXT1632(auVar102));
            auVar113 = vfmadd231ps_fma(ZEXT1632(auVar110),ZEXT1632(auVar106),
                                       ZEXT1232(ZEXT412(0)) << 0x20);
            auVar133 = vrcp14ps_avx512vl(ZEXT1632(auVar113));
            auVar224 = ZEXT3264(auVar133);
            auVar39._8_4_ = 0x3f800000;
            auVar39._0_8_ = 0x3f8000003f800000;
            auVar39._12_4_ = 0x3f800000;
            auVar39._16_4_ = 0x3f800000;
            auVar39._20_4_ = 0x3f800000;
            auVar39._24_4_ = 0x3f800000;
            auVar39._28_4_ = 0x3f800000;
            auVar134 = vfnmadd213ps_avx512vl(auVar133,ZEXT1632(auVar113),auVar39);
            auVar110 = vfmadd132ps_fma(auVar134,auVar133,auVar133);
            auVar222 = ZEXT1664(auVar110);
            auVar66._4_4_ = auVar102._4_4_ * auVar150._4_4_;
            auVar66._0_4_ = auVar102._0_4_ * auVar150._0_4_;
            auVar66._8_4_ = auVar102._8_4_ * auVar150._8_4_;
            auVar66._12_4_ = auVar102._12_4_ * auVar150._12_4_;
            auVar66._16_4_ = fVar190 * 0.0;
            auVar66._20_4_ = fVar227 * 0.0;
            auVar66._24_4_ = fVar228 * 0.0;
            auVar66._28_4_ = iVar1;
            auVar112 = vfmadd231ps_fma(auVar66,auVar121,ZEXT1632(auVar112));
            auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar129,ZEXT1632(auVar106));
            fVar190 = auVar110._0_4_;
            fVar227 = auVar110._4_4_;
            fVar228 = auVar110._8_4_;
            fVar184 = auVar110._12_4_;
            local_5a0 = ZEXT1632(CONCAT412(auVar112._12_4_ * fVar184,
                                           CONCAT48(auVar112._8_4_ * fVar228,
                                                    CONCAT44(auVar112._4_4_ * fVar227,
                                                             auVar112._0_4_ * fVar190))));
            auVar159 = ZEXT3264(local_5a0);
            auVar84._4_4_ = uStack_75c;
            auVar84._0_4_ = local_760;
            auVar84._8_4_ = uStack_758;
            auVar84._12_4_ = uStack_754;
            auVar84._16_4_ = uStack_750;
            auVar84._20_4_ = uStack_74c;
            auVar84._24_4_ = uStack_748;
            auVar84._28_4_ = uStack_744;
            uVar185 = vcmpps_avx512vl(local_5a0,auVar84,0xd);
            uVar183 = *(undefined4 *)(ray + k * 4 + 0x200);
            auVar40._4_4_ = uVar183;
            auVar40._0_4_ = uVar183;
            auVar40._8_4_ = uVar183;
            auVar40._12_4_ = uVar183;
            auVar40._16_4_ = uVar183;
            auVar40._20_4_ = uVar183;
            auVar40._24_4_ = uVar183;
            auVar40._28_4_ = uVar183;
            uVar29 = vcmpps_avx512vl(local_5a0,auVar40,2);
            bVar93 = (byte)uVar185 & (byte)uVar29 & bVar93;
            if (bVar93 != 0) {
              uVar94 = vcmpps_avx512vl(ZEXT1632(auVar113),ZEXT1232(ZEXT412(0)) << 0x20,4);
              uVar94 = bVar93 & uVar94;
              if ((char)uVar94 != '\0') {
                fVar189 = auVar124._0_4_ * fVar190;
                fVar198 = auVar124._4_4_ * fVar227;
                auVar67._4_4_ = fVar198;
                auVar67._0_4_ = fVar189;
                fVar95 = auVar124._8_4_ * fVar228;
                auVar67._8_4_ = fVar95;
                fVar96 = auVar124._12_4_ * fVar184;
                auVar67._12_4_ = fVar96;
                fVar161 = auVar124._16_4_ * 0.0;
                auVar67._16_4_ = fVar161;
                fVar162 = auVar124._20_4_ * 0.0;
                auVar67._20_4_ = fVar162;
                fVar163 = auVar124._24_4_ * 0.0;
                auVar67._24_4_ = fVar163;
                auVar67._28_4_ = auVar124._28_4_;
                auVar197._8_4_ = 0x3f800000;
                auVar197._0_8_ = 0x3f8000003f800000;
                auVar197._12_4_ = 0x3f800000;
                auVar197._16_4_ = 0x3f800000;
                auVar197._20_4_ = 0x3f800000;
                auVar197._24_4_ = 0x3f800000;
                auVar197._28_4_ = 0x3f800000;
                auVar133 = vsubps_avx(auVar197,auVar67);
                local_5e0._0_4_ =
                     (float)((uint)(bVar85 & 1) * (int)fVar189 |
                            (uint)!(bool)(bVar85 & 1) * auVar133._0_4_);
                bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
                local_5e0._4_4_ =
                     (float)((uint)bVar12 * (int)fVar198 | (uint)!bVar12 * auVar133._4_4_);
                bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                local_5e0._8_4_ =
                     (float)((uint)bVar12 * (int)fVar95 | (uint)!bVar12 * auVar133._8_4_);
                bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
                local_5e0._12_4_ =
                     (float)((uint)bVar12 * (int)fVar96 | (uint)!bVar12 * auVar133._12_4_);
                bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
                local_5e0._16_4_ =
                     (float)((uint)bVar12 * (int)fVar161 | (uint)!bVar12 * auVar133._16_4_);
                bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
                local_5e0._20_4_ =
                     (float)((uint)bVar12 * (int)fVar162 | (uint)!bVar12 * auVar133._20_4_);
                bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
                local_5e0._24_4_ =
                     (float)((uint)bVar12 * (int)fVar163 | (uint)!bVar12 * auVar133._24_4_);
                bVar12 = SUB81(uVar88 >> 7,0);
                local_5e0._28_4_ =
                     (float)((uint)bVar12 * auVar124._28_4_ | (uint)!bVar12 * auVar133._28_4_);
                auVar133 = vsubps_avx(auVar123,auVar122);
                auVar110 = vfmadd213ps_fma(auVar133,local_5e0,auVar122);
                uVar183 = *(undefined4 *)((long)local_7e0->ray_space + k * 4 + -0x40);
                auVar41._4_4_ = uVar183;
                auVar41._0_4_ = uVar183;
                auVar41._8_4_ = uVar183;
                auVar41._12_4_ = uVar183;
                auVar41._16_4_ = uVar183;
                auVar41._20_4_ = uVar183;
                auVar41._24_4_ = uVar183;
                auVar41._28_4_ = uVar183;
                auVar133 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar110._12_4_ + auVar110._12_4_,
                                                              CONCAT48(auVar110._8_4_ +
                                                                       auVar110._8_4_,
                                                                       CONCAT44(auVar110._4_4_ +
                                                                                auVar110._4_4_,
                                                                                auVar110._0_4_ +
                                                                                auVar110._0_4_)))),
                                           auVar41);
                uVar28 = vcmpps_avx512vl(local_5a0,auVar133,6);
                uVar94 = uVar94 & uVar28;
                bVar93 = (byte)uVar94;
                if (bVar93 != 0) {
                  auVar188._0_4_ = auVar125._0_4_ * fVar190;
                  auVar188._4_4_ = auVar125._4_4_ * fVar227;
                  auVar188._8_4_ = auVar125._8_4_ * fVar228;
                  auVar188._12_4_ = auVar125._12_4_ * fVar184;
                  auVar188._16_4_ = auVar125._16_4_ * 0.0;
                  auVar188._20_4_ = auVar125._20_4_ * 0.0;
                  auVar188._24_4_ = auVar125._24_4_ * 0.0;
                  auVar188._28_4_ = 0;
                  auVar206._8_4_ = 0x3f800000;
                  auVar206._0_8_ = 0x3f8000003f800000;
                  auVar206._12_4_ = 0x3f800000;
                  auVar206._16_4_ = 0x3f800000;
                  auVar206._20_4_ = 0x3f800000;
                  auVar206._24_4_ = 0x3f800000;
                  auVar206._28_4_ = 0x3f800000;
                  auVar133 = vsubps_avx(auVar206,auVar188);
                  auVar155._0_4_ =
                       (uint)(bVar85 & 1) * (int)auVar188._0_4_ |
                       (uint)!(bool)(bVar85 & 1) * auVar133._0_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 1) & 1);
                  auVar155._4_4_ =
                       (uint)bVar12 * (int)auVar188._4_4_ | (uint)!bVar12 * auVar133._4_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 2) & 1);
                  auVar155._8_4_ =
                       (uint)bVar12 * (int)auVar188._8_4_ | (uint)!bVar12 * auVar133._8_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 3) & 1);
                  auVar155._12_4_ =
                       (uint)bVar12 * (int)auVar188._12_4_ | (uint)!bVar12 * auVar133._12_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 4) & 1);
                  auVar155._16_4_ =
                       (uint)bVar12 * (int)auVar188._16_4_ | (uint)!bVar12 * auVar133._16_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 5) & 1);
                  auVar155._20_4_ =
                       (uint)bVar12 * (int)auVar188._20_4_ | (uint)!bVar12 * auVar133._20_4_;
                  bVar12 = (bool)((byte)(uVar88 >> 6) & 1);
                  auVar155._24_4_ =
                       (uint)bVar12 * (int)auVar188._24_4_ | (uint)!bVar12 * auVar133._24_4_;
                  auVar155._28_4_ = (uint)!SUB81(uVar88 >> 7,0) * auVar133._28_4_;
                  auVar42._8_4_ = 0x40000000;
                  auVar42._0_8_ = 0x4000000040000000;
                  auVar42._12_4_ = 0x40000000;
                  auVar42._16_4_ = 0x40000000;
                  auVar42._20_4_ = 0x40000000;
                  auVar42._24_4_ = 0x40000000;
                  auVar42._28_4_ = 0x40000000;
                  local_5c0 = vfmsub132ps_avx512vl(auVar155,auVar206,auVar42);
                  local_580 = (undefined4)lVar89;
                  local_570 = local_840;
                  uStack_568 = uStack_838;
                  local_560 = local_850;
                  uStack_558 = uStack_848;
                  local_550 = local_860;
                  uStack_548 = uStack_858;
                  local_540 = local_870;
                  uStack_538 = uStack_868;
                  pGVar91 = (context->scene->geometries).items[uVar6].ptr;
                  if ((pGVar91->mask & *(uint *)(ray + k * 4 + 0x240)) != 0) {
                    auVar110 = vcvtsi2ss_avx512f(auVar118,local_580);
                    fVar190 = auVar110._0_4_;
                    local_520[0] = (fVar190 + local_5e0._0_4_ + 0.0) * local_420;
                    local_520[1] = (fVar190 + local_5e0._4_4_ + 1.0) * fStack_41c;
                    local_520[2] = (fVar190 + local_5e0._8_4_ + 2.0) * fStack_418;
                    local_520[3] = (fVar190 + local_5e0._12_4_ + 3.0) * fStack_414;
                    fStack_510 = (fVar190 + local_5e0._16_4_ + 4.0) * fStack_410;
                    fStack_50c = (fVar190 + local_5e0._20_4_ + 5.0) * fStack_40c;
                    fStack_508 = (fVar190 + local_5e0._24_4_ + 6.0) * fStack_408;
                    fStack_504 = fVar190 + local_5e0._28_4_ + 7.0;
                    local_500 = local_5c0;
                    local_4e0 = local_5a0;
                    auVar177._8_4_ = 0x7f800000;
                    auVar177._0_8_ = 0x7f8000007f800000;
                    auVar177._12_4_ = 0x7f800000;
                    auVar177._16_4_ = 0x7f800000;
                    auVar177._20_4_ = 0x7f800000;
                    auVar177._24_4_ = 0x7f800000;
                    auVar177._28_4_ = 0x7f800000;
                    auVar133 = vblendmps_avx512vl(auVar177,local_5a0);
                    auVar156._0_4_ =
                         (uint)(bVar93 & 1) * auVar133._0_4_ |
                         (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar94 >> 1) & 1);
                    auVar156._4_4_ = (uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar94 >> 2) & 1);
                    auVar156._8_4_ = (uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar94 >> 3) & 1);
                    auVar156._12_4_ = (uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar94 >> 4) & 1);
                    auVar156._16_4_ = (uint)bVar12 * auVar133._16_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar94 >> 5) & 1);
                    auVar156._20_4_ = (uint)bVar12 * auVar133._20_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = (bool)((byte)(uVar94 >> 6) & 1);
                    auVar156._24_4_ = (uint)bVar12 * auVar133._24_4_ | (uint)!bVar12 * 0x7f800000;
                    bVar12 = SUB81(uVar94 >> 7,0);
                    auVar156._28_4_ = (uint)bVar12 * auVar133._28_4_ | (uint)!bVar12 * 0x7f800000;
                    auVar133 = vshufps_avx(auVar156,auVar156,0xb1);
                    auVar133 = vminps_avx(auVar156,auVar133);
                    auVar134 = vshufpd_avx(auVar133,auVar133,5);
                    auVar133 = vminps_avx(auVar133,auVar134);
                    auVar134 = vpermpd_avx2(auVar133,0x4e);
                    auVar133 = vminps_avx(auVar133,auVar134);
                    uVar185 = vcmpps_avx512vl(auVar156,auVar133,0);
                    uVar86 = (uint)uVar94;
                    if ((bVar93 & (byte)uVar185) != 0) {
                      uVar86 = (uint)(bVar93 & (byte)uVar185);
                    }
                    uVar87 = 0;
                    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
                      uVar87 = uVar87 + 1;
                    }
                    uVar88 = (ulong)uVar87;
                    if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                       (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                      local_800 = ZEXT416(*(uint *)(ray + k * 4 + 0x200));
                      local_7f0 = pGVar91;
                      local_7c0 = local_5a0;
                      local_57c = iVar7;
                      do {
                        local_200 = vbroadcastss_avx512f(ZEXT416((uint)local_520[uVar88]));
                        local_1c0 = vbroadcastss_avx512f(ZEXT416(*(uint *)(local_500 + uVar88 * 4)))
                        ;
                        *(undefined4 *)(ray + k * 4 + 0x200) =
                             *(undefined4 *)(local_4e0 + uVar88 * 4);
                        local_830.context = context->user;
                        fVar184 = local_200._0_4_;
                        fVar190 = 1.0 - fVar184;
                        auVar34._8_4_ = 0x80000000;
                        auVar34._0_8_ = 0x8000000080000000;
                        auVar34._12_4_ = 0x80000000;
                        auVar112 = vxorps_avx512vl(ZEXT416((uint)fVar190),auVar34);
                        auVar110 = ZEXT416((uint)(fVar184 * fVar190 * 4.0));
                        auVar113 = vfnmsub213ss_fma(local_200._0_16_,local_200._0_16_,auVar110);
                        auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),
                                                   auVar110);
                        auVar224 = ZEXT464(0x3f000000);
                        fVar190 = fVar190 * auVar112._0_4_ * 0.5;
                        fVar227 = auVar113._0_4_ * 0.5;
                        fVar228 = auVar110._0_4_ * 0.5;
                        fVar184 = fVar184 * fVar184 * 0.5;
                        auVar220._0_4_ = fVar184 * fVar26;
                        auVar220._4_4_ = fVar184 * fVar68;
                        auVar220._8_4_ = fVar184 * fVar69;
                        auVar220._12_4_ = fVar184 * fVar70;
                        auVar170._4_4_ = fVar228;
                        auVar170._0_4_ = fVar228;
                        auVar170._8_4_ = fVar228;
                        auVar170._12_4_ = fVar228;
                        auVar110 = vfmadd132ps_fma(auVar170,auVar220,auVar108);
                        auVar213._4_4_ = fVar227;
                        auVar213._0_4_ = fVar227;
                        auVar213._8_4_ = fVar227;
                        auVar213._12_4_ = fVar227;
                        auVar110 = vfmadd132ps_fma(auVar213,auVar110,auVar27);
                        auVar171._4_4_ = fVar190;
                        auVar171._0_4_ = fVar190;
                        auVar171._8_4_ = fVar190;
                        auVar171._12_4_ = fVar190;
                        auVar110 = vfmadd132ps_fma(auVar171,auVar110,auVar111);
                        auVar182 = vbroadcastss_avx512f(auVar110);
                        auVar243 = vbroadcastss_avx512f(ZEXT416(1));
                        auVar219 = vpermps_avx512f(auVar243,ZEXT1664(auVar110));
                        auVar222 = vbroadcastss_avx512f(ZEXT416(2));
                        local_240 = vpermps_avx512f(auVar222,ZEXT1664(auVar110));
                        local_2c0[0] = (RTCHitN)auVar182[0];
                        local_2c0[1] = (RTCHitN)auVar182[1];
                        local_2c0[2] = (RTCHitN)auVar182[2];
                        local_2c0[3] = (RTCHitN)auVar182[3];
                        local_2c0[4] = (RTCHitN)auVar182[4];
                        local_2c0[5] = (RTCHitN)auVar182[5];
                        local_2c0[6] = (RTCHitN)auVar182[6];
                        local_2c0[7] = (RTCHitN)auVar182[7];
                        local_2c0[8] = (RTCHitN)auVar182[8];
                        local_2c0[9] = (RTCHitN)auVar182[9];
                        local_2c0[10] = (RTCHitN)auVar182[10];
                        local_2c0[0xb] = (RTCHitN)auVar182[0xb];
                        local_2c0[0xc] = (RTCHitN)auVar182[0xc];
                        local_2c0[0xd] = (RTCHitN)auVar182[0xd];
                        local_2c0[0xe] = (RTCHitN)auVar182[0xe];
                        local_2c0[0xf] = (RTCHitN)auVar182[0xf];
                        local_2c0[0x10] = (RTCHitN)auVar182[0x10];
                        local_2c0[0x11] = (RTCHitN)auVar182[0x11];
                        local_2c0[0x12] = (RTCHitN)auVar182[0x12];
                        local_2c0[0x13] = (RTCHitN)auVar182[0x13];
                        local_2c0[0x14] = (RTCHitN)auVar182[0x14];
                        local_2c0[0x15] = (RTCHitN)auVar182[0x15];
                        local_2c0[0x16] = (RTCHitN)auVar182[0x16];
                        local_2c0[0x17] = (RTCHitN)auVar182[0x17];
                        local_2c0[0x18] = (RTCHitN)auVar182[0x18];
                        local_2c0[0x19] = (RTCHitN)auVar182[0x19];
                        local_2c0[0x1a] = (RTCHitN)auVar182[0x1a];
                        local_2c0[0x1b] = (RTCHitN)auVar182[0x1b];
                        local_2c0[0x1c] = (RTCHitN)auVar182[0x1c];
                        local_2c0[0x1d] = (RTCHitN)auVar182[0x1d];
                        local_2c0[0x1e] = (RTCHitN)auVar182[0x1e];
                        local_2c0[0x1f] = (RTCHitN)auVar182[0x1f];
                        local_2c0[0x20] = (RTCHitN)auVar182[0x20];
                        local_2c0[0x21] = (RTCHitN)auVar182[0x21];
                        local_2c0[0x22] = (RTCHitN)auVar182[0x22];
                        local_2c0[0x23] = (RTCHitN)auVar182[0x23];
                        local_2c0[0x24] = (RTCHitN)auVar182[0x24];
                        local_2c0[0x25] = (RTCHitN)auVar182[0x25];
                        local_2c0[0x26] = (RTCHitN)auVar182[0x26];
                        local_2c0[0x27] = (RTCHitN)auVar182[0x27];
                        local_2c0[0x28] = (RTCHitN)auVar182[0x28];
                        local_2c0[0x29] = (RTCHitN)auVar182[0x29];
                        local_2c0[0x2a] = (RTCHitN)auVar182[0x2a];
                        local_2c0[0x2b] = (RTCHitN)auVar182[0x2b];
                        local_2c0[0x2c] = (RTCHitN)auVar182[0x2c];
                        local_2c0[0x2d] = (RTCHitN)auVar182[0x2d];
                        local_2c0[0x2e] = (RTCHitN)auVar182[0x2e];
                        local_2c0[0x2f] = (RTCHitN)auVar182[0x2f];
                        local_2c0[0x30] = (RTCHitN)auVar182[0x30];
                        local_2c0[0x31] = (RTCHitN)auVar182[0x31];
                        local_2c0[0x32] = (RTCHitN)auVar182[0x32];
                        local_2c0[0x33] = (RTCHitN)auVar182[0x33];
                        local_2c0[0x34] = (RTCHitN)auVar182[0x34];
                        local_2c0[0x35] = (RTCHitN)auVar182[0x35];
                        local_2c0[0x36] = (RTCHitN)auVar182[0x36];
                        local_2c0[0x37] = (RTCHitN)auVar182[0x37];
                        local_2c0[0x38] = (RTCHitN)auVar182[0x38];
                        local_2c0[0x39] = (RTCHitN)auVar182[0x39];
                        local_2c0[0x3a] = (RTCHitN)auVar182[0x3a];
                        local_2c0[0x3b] = (RTCHitN)auVar182[0x3b];
                        local_2c0[0x3c] = (RTCHitN)auVar182[0x3c];
                        local_2c0[0x3d] = (RTCHitN)auVar182[0x3d];
                        local_2c0[0x3e] = (RTCHitN)auVar182[0x3e];
                        local_2c0[0x3f] = (RTCHitN)auVar182[0x3f];
                        local_280 = auVar219;
                        local_180 = local_340._0_8_;
                        uStack_178 = local_340._8_8_;
                        uStack_170 = local_340._16_8_;
                        uStack_168 = local_340._24_8_;
                        uStack_160 = local_340._32_8_;
                        uStack_158 = local_340._40_8_;
                        uStack_150 = local_340._48_8_;
                        uStack_148 = local_340._56_8_;
                        auVar182 = vmovdqa64_avx512f(local_300);
                        local_140 = vmovdqa64_avx512f(auVar182);
                        auVar133 = vpcmpeqd_avx2(auVar182._0_32_,auVar182._0_32_);
                        local_7e8[3] = auVar133;
                        local_7e8[2] = auVar133;
                        local_7e8[1] = auVar133;
                        *local_7e8 = auVar133;
                        local_100 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instID[0]));
                        local_c0 = vbroadcastss_avx512f(ZEXT416((local_830.context)->instPrimID[0]))
                        ;
                        auVar182 = vmovdqa64_avx512f(local_380);
                        local_740 = vmovdqa64_avx512f(auVar182);
                        local_830.valid = (int *)local_740;
                        local_830.geometryUserPtr = pGVar91->userPtr;
                        local_830.hit = local_2c0;
                        local_830.N = 0x10;
                        local_830.ray = (RTCRayN *)ray;
                        if (pGVar91->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar219 = ZEXT1664(auVar219._0_16_);
                          auVar222 = ZEXT1664(auVar222._0_16_);
                          auVar224 = ZEXT1664(auVar224._0_16_);
                          (*pGVar91->intersectionFilterN)(&local_830);
                          auVar159 = ZEXT3264(local_7c0);
                          auVar182 = vmovdqa64_avx512f(local_740);
                          pGVar91 = local_7f0;
                        }
                        uVar185 = vptestmd_avx512f(auVar182,auVar182);
                        if ((short)uVar185 == 0) {
LAB_018ee053:
                          *(undefined4 *)(ray + k * 4 + 0x200) = local_800._0_4_;
                        }
                        else {
                          p_Var11 = context->args->filter;
                          if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar91->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar219 = ZEXT1664(auVar219._0_16_);
                            auVar222 = ZEXT1664(auVar222._0_16_);
                            auVar224 = ZEXT1664(auVar224._0_16_);
                            (*p_Var11)(&local_830);
                            auVar159 = ZEXT3264(local_7c0);
                            auVar182 = vmovdqa64_avx512f(local_740);
                            pGVar91 = local_7f0;
                          }
                          uVar28 = vptestmd_avx512f(auVar182,auVar182);
                          if ((short)uVar28 == 0) goto LAB_018ee053;
                          iVar1 = *(int *)(local_830.hit + 4);
                          iVar2 = *(int *)(local_830.hit + 8);
                          iVar71 = *(int *)(local_830.hit + 0xc);
                          iVar72 = *(int *)(local_830.hit + 0x10);
                          iVar73 = *(int *)(local_830.hit + 0x14);
                          iVar74 = *(int *)(local_830.hit + 0x18);
                          iVar75 = *(int *)(local_830.hit + 0x1c);
                          iVar76 = *(int *)(local_830.hit + 0x20);
                          iVar77 = *(int *)(local_830.hit + 0x24);
                          iVar78 = *(int *)(local_830.hit + 0x28);
                          iVar79 = *(int *)(local_830.hit + 0x2c);
                          iVar80 = *(int *)(local_830.hit + 0x30);
                          iVar81 = *(int *)(local_830.hit + 0x34);
                          iVar82 = *(int *)(local_830.hit + 0x38);
                          iVar83 = *(int *)(local_830.hit + 0x3c);
                          bVar93 = (byte)uVar28;
                          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar85 = (byte)(uVar28 >> 8);
                          bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar25 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x300) =
                               (uint)(bVar93 & 1) * *(int *)local_830.hit |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x300);
                          *(uint *)(local_830.ray + 0x304) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_830.ray + 0x304);
                          *(uint *)(local_830.ray + 0x308) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x308);
                          *(uint *)(local_830.ray + 0x30c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x30c);
                          *(uint *)(local_830.ray + 0x310) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x310);
                          *(uint *)(local_830.ray + 0x314) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x314);
                          *(uint *)(local_830.ray + 0x318) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x318);
                          *(uint *)(local_830.ray + 0x31c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x31c);
                          *(uint *)(local_830.ray + 800) =
                               (uint)(bVar85 & 1) * iVar76 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 800);
                          *(uint *)(local_830.ray + 0x324) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x324);
                          *(uint *)(local_830.ray + 0x328) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x328);
                          *(uint *)(local_830.ray + 0x32c) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x32c);
                          *(uint *)(local_830.ray + 0x330) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x330);
                          *(uint *)(local_830.ray + 0x334) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x334);
                          *(uint *)(local_830.ray + 0x338) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x338);
                          *(uint *)(local_830.ray + 0x33c) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x33c);
                          iVar1 = *(int *)(local_830.hit + 0x44);
                          iVar2 = *(int *)(local_830.hit + 0x48);
                          iVar71 = *(int *)(local_830.hit + 0x4c);
                          iVar72 = *(int *)(local_830.hit + 0x50);
                          iVar73 = *(int *)(local_830.hit + 0x54);
                          iVar74 = *(int *)(local_830.hit + 0x58);
                          iVar75 = *(int *)(local_830.hit + 0x5c);
                          iVar76 = *(int *)(local_830.hit + 0x60);
                          iVar77 = *(int *)(local_830.hit + 100);
                          iVar78 = *(int *)(local_830.hit + 0x68);
                          iVar79 = *(int *)(local_830.hit + 0x6c);
                          iVar80 = *(int *)(local_830.hit + 0x70);
                          iVar81 = *(int *)(local_830.hit + 0x74);
                          iVar82 = *(int *)(local_830.hit + 0x78);
                          iVar83 = *(int *)(local_830.hit + 0x7c);
                          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar25 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x340) =
                               (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0x40) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x340);
                          *(uint *)(local_830.ray + 0x344) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_830.ray + 0x344);
                          *(uint *)(local_830.ray + 0x348) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x348);
                          *(uint *)(local_830.ray + 0x34c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x34c);
                          *(uint *)(local_830.ray + 0x350) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x350);
                          *(uint *)(local_830.ray + 0x354) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x354);
                          *(uint *)(local_830.ray + 0x358) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x358);
                          *(uint *)(local_830.ray + 0x35c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x35c);
                          *(uint *)(local_830.ray + 0x360) =
                               (uint)(bVar85 & 1) * iVar76 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x360);
                          *(uint *)(local_830.ray + 0x364) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x364);
                          *(uint *)(local_830.ray + 0x368) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x368);
                          *(uint *)(local_830.ray + 0x36c) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x36c);
                          *(uint *)(local_830.ray + 0x370) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x370);
                          *(uint *)(local_830.ray + 0x374) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x374);
                          *(uint *)(local_830.ray + 0x378) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x378);
                          *(uint *)(local_830.ray + 0x37c) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x37c);
                          iVar1 = *(int *)(local_830.hit + 0x84);
                          iVar2 = *(int *)(local_830.hit + 0x88);
                          iVar71 = *(int *)(local_830.hit + 0x8c);
                          iVar72 = *(int *)(local_830.hit + 0x90);
                          iVar73 = *(int *)(local_830.hit + 0x94);
                          iVar74 = *(int *)(local_830.hit + 0x98);
                          iVar75 = *(int *)(local_830.hit + 0x9c);
                          iVar76 = *(int *)(local_830.hit + 0xa0);
                          iVar77 = *(int *)(local_830.hit + 0xa4);
                          iVar78 = *(int *)(local_830.hit + 0xa8);
                          iVar79 = *(int *)(local_830.hit + 0xac);
                          iVar80 = *(int *)(local_830.hit + 0xb0);
                          iVar81 = *(int *)(local_830.hit + 0xb4);
                          iVar82 = *(int *)(local_830.hit + 0xb8);
                          iVar83 = *(int *)(local_830.hit + 0xbc);
                          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar25 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x380) =
                               (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0x80) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x380);
                          *(uint *)(local_830.ray + 900) =
                               (uint)bVar12 * iVar1 | (uint)!bVar12 * *(int *)(local_830.ray + 900);
                          *(uint *)(local_830.ray + 0x388) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x388);
                          *(uint *)(local_830.ray + 0x38c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x38c);
                          *(uint *)(local_830.ray + 0x390) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x390);
                          *(uint *)(local_830.ray + 0x394) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x394);
                          *(uint *)(local_830.ray + 0x398) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x398);
                          *(uint *)(local_830.ray + 0x39c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x39c);
                          *(uint *)(local_830.ray + 0x3a0) =
                               (uint)(bVar85 & 1) * iVar76 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x3a0);
                          *(uint *)(local_830.ray + 0x3a4) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3a4);
                          *(uint *)(local_830.ray + 0x3a8) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x3a8);
                          *(uint *)(local_830.ray + 0x3ac) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x3ac);
                          *(uint *)(local_830.ray + 0x3b0) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3b0);
                          *(uint *)(local_830.ray + 0x3b4) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3b4);
                          *(uint *)(local_830.ray + 0x3b8) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3b8);
                          *(uint *)(local_830.ray + 0x3bc) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3bc);
                          iVar1 = *(int *)(local_830.hit + 0xc4);
                          iVar2 = *(int *)(local_830.hit + 200);
                          iVar71 = *(int *)(local_830.hit + 0xcc);
                          iVar72 = *(int *)(local_830.hit + 0xd0);
                          iVar73 = *(int *)(local_830.hit + 0xd4);
                          iVar74 = *(int *)(local_830.hit + 0xd8);
                          iVar75 = *(int *)(local_830.hit + 0xdc);
                          iVar76 = *(int *)(local_830.hit + 0xe0);
                          iVar77 = *(int *)(local_830.hit + 0xe4);
                          iVar78 = *(int *)(local_830.hit + 0xe8);
                          iVar79 = *(int *)(local_830.hit + 0xec);
                          iVar80 = *(int *)(local_830.hit + 0xf0);
                          iVar81 = *(int *)(local_830.hit + 0xf4);
                          iVar82 = *(int *)(local_830.hit + 0xf8);
                          iVar83 = *(int *)(local_830.hit + 0xfc);
                          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar25 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x3c0) =
                               (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0xc0) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x3c0);
                          *(uint *)(local_830.ray + 0x3c4) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_830.ray + 0x3c4);
                          *(uint *)(local_830.ray + 0x3c8) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x3c8);
                          *(uint *)(local_830.ray + 0x3cc) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x3cc);
                          *(uint *)(local_830.ray + 0x3d0) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x3d0);
                          *(uint *)(local_830.ray + 0x3d4) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x3d4);
                          *(uint *)(local_830.ray + 0x3d8) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x3d8);
                          *(uint *)(local_830.ray + 0x3dc) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x3dc);
                          *(uint *)(local_830.ray + 0x3e0) =
                               (uint)(bVar85 & 1) * iVar76 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x3e0);
                          *(uint *)(local_830.ray + 0x3e4) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x3e4);
                          *(uint *)(local_830.ray + 1000) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 1000);
                          *(uint *)(local_830.ray + 0x3ec) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x3ec);
                          *(uint *)(local_830.ray + 0x3f0) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x3f0);
                          *(uint *)(local_830.ray + 0x3f4) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x3f4);
                          *(uint *)(local_830.ray + 0x3f8) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x3f8);
                          *(uint *)(local_830.ray + 0x3fc) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x3fc);
                          iVar1 = *(int *)(local_830.hit + 0x104);
                          iVar2 = *(int *)(local_830.hit + 0x108);
                          iVar71 = *(int *)(local_830.hit + 0x10c);
                          iVar72 = *(int *)(local_830.hit + 0x110);
                          iVar73 = *(int *)(local_830.hit + 0x114);
                          iVar74 = *(int *)(local_830.hit + 0x118);
                          iVar75 = *(int *)(local_830.hit + 0x11c);
                          iVar76 = *(int *)(local_830.hit + 0x120);
                          iVar77 = *(int *)(local_830.hit + 0x124);
                          iVar78 = *(int *)(local_830.hit + 0x128);
                          iVar79 = *(int *)(local_830.hit + 300);
                          iVar80 = *(int *)(local_830.hit + 0x130);
                          iVar81 = *(int *)(local_830.hit + 0x134);
                          iVar82 = *(int *)(local_830.hit + 0x138);
                          iVar83 = *(int *)(local_830.hit + 0x13c);
                          bVar12 = (bool)((byte)(uVar28 >> 1) & 1);
                          bVar13 = (bool)((byte)(uVar28 >> 2) & 1);
                          bVar14 = (bool)((byte)(uVar28 >> 3) & 1);
                          bVar15 = (bool)((byte)(uVar28 >> 4) & 1);
                          bVar16 = (bool)((byte)(uVar28 >> 5) & 1);
                          bVar17 = (bool)((byte)(uVar28 >> 6) & 1);
                          bVar18 = (bool)((byte)(uVar28 >> 7) & 1);
                          bVar19 = (bool)((byte)(uVar28 >> 9) & 1);
                          bVar20 = (bool)((byte)(uVar28 >> 10) & 1);
                          bVar21 = (bool)((byte)(uVar28 >> 0xb) & 1);
                          bVar22 = (bool)((byte)(uVar28 >> 0xc) & 1);
                          bVar23 = (bool)((byte)(uVar28 >> 0xd) & 1);
                          bVar24 = (bool)((byte)(uVar28 >> 0xe) & 1);
                          bVar25 = SUB81(uVar28 >> 0xf,0);
                          *(uint *)(local_830.ray + 0x400) =
                               (uint)(bVar93 & 1) * *(int *)(local_830.hit + 0x100) |
                               (uint)!(bool)(bVar93 & 1) * *(int *)(local_830.ray + 0x400);
                          *(uint *)(local_830.ray + 0x404) =
                               (uint)bVar12 * iVar1 |
                               (uint)!bVar12 * *(int *)(local_830.ray + 0x404);
                          *(uint *)(local_830.ray + 0x408) =
                               (uint)bVar13 * iVar2 |
                               (uint)!bVar13 * *(int *)(local_830.ray + 0x408);
                          *(uint *)(local_830.ray + 0x40c) =
                               (uint)bVar14 * iVar71 |
                               (uint)!bVar14 * *(int *)(local_830.ray + 0x40c);
                          *(uint *)(local_830.ray + 0x410) =
                               (uint)bVar15 * iVar72 |
                               (uint)!bVar15 * *(int *)(local_830.ray + 0x410);
                          *(uint *)(local_830.ray + 0x414) =
                               (uint)bVar16 * iVar73 |
                               (uint)!bVar16 * *(int *)(local_830.ray + 0x414);
                          *(uint *)(local_830.ray + 0x418) =
                               (uint)bVar17 * iVar74 |
                               (uint)!bVar17 * *(int *)(local_830.ray + 0x418);
                          *(uint *)(local_830.ray + 0x41c) =
                               (uint)bVar18 * iVar75 |
                               (uint)!bVar18 * *(int *)(local_830.ray + 0x41c);
                          *(uint *)(local_830.ray + 0x420) =
                               (uint)(bVar85 & 1) * iVar76 |
                               (uint)!(bool)(bVar85 & 1) * *(int *)(local_830.ray + 0x420);
                          *(uint *)(local_830.ray + 0x424) =
                               (uint)bVar19 * iVar77 |
                               (uint)!bVar19 * *(int *)(local_830.ray + 0x424);
                          *(uint *)(local_830.ray + 0x428) =
                               (uint)bVar20 * iVar78 |
                               (uint)!bVar20 * *(int *)(local_830.ray + 0x428);
                          *(uint *)(local_830.ray + 0x42c) =
                               (uint)bVar21 * iVar79 |
                               (uint)!bVar21 * *(int *)(local_830.ray + 0x42c);
                          *(uint *)(local_830.ray + 0x430) =
                               (uint)bVar22 * iVar80 |
                               (uint)!bVar22 * *(int *)(local_830.ray + 0x430);
                          *(uint *)(local_830.ray + 0x434) =
                               (uint)bVar23 * iVar81 |
                               (uint)!bVar23 * *(int *)(local_830.ray + 0x434);
                          *(uint *)(local_830.ray + 0x438) =
                               (uint)bVar24 * iVar82 |
                               (uint)!bVar24 * *(int *)(local_830.ray + 0x438);
                          *(uint *)(local_830.ray + 0x43c) =
                               (uint)bVar25 * iVar83 |
                               (uint)!bVar25 * *(int *)(local_830.ray + 0x43c);
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x140)
                                                      );
                          auVar182 = vmovdqu32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_830.ray + 0x440) = auVar182;
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x180)
                                                      );
                          auVar182 = vmovdqu32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_830.ray + 0x480) = auVar182;
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x1c0)
                                                      );
                          auVar182 = vmovdqa32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_830.ray + 0x4c0) = auVar182;
                          auVar182 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_830.hit + 0x200)
                                                      );
                          auVar182 = vmovdqa32_avx512f(auVar182);
                          *(undefined1 (*) [64])(local_830.ray + 0x500) = auVar182;
                          local_800._0_4_ = *(undefined4 *)(ray + k * 4 + 0x200);
                          local_800._4_4_ = 0;
                          local_800._8_4_ = 0;
                          local_800._12_4_ = 0;
                        }
                        bVar93 = ~(byte)(1 << ((uint)uVar88 & 0x1f)) & (byte)uVar94;
                        auVar178._4_4_ = local_800._0_4_;
                        auVar178._0_4_ = local_800._0_4_;
                        auVar178._8_4_ = local_800._0_4_;
                        auVar178._12_4_ = local_800._0_4_;
                        auVar178._16_4_ = local_800._0_4_;
                        auVar178._20_4_ = local_800._0_4_;
                        auVar178._24_4_ = local_800._0_4_;
                        auVar178._28_4_ = local_800._0_4_;
                        uVar185 = vcmpps_avx512vl(auVar159._0_32_,auVar178,2);
                        if ((bVar93 & (byte)uVar185) == 0) goto LAB_018ee0f3;
                        bVar93 = bVar93 & (byte)uVar185;
                        uVar94 = (ulong)bVar93;
                        auVar179._8_4_ = 0x7f800000;
                        auVar179._0_8_ = 0x7f8000007f800000;
                        auVar179._12_4_ = 0x7f800000;
                        auVar179._16_4_ = 0x7f800000;
                        auVar179._20_4_ = 0x7f800000;
                        auVar179._24_4_ = 0x7f800000;
                        auVar179._28_4_ = 0x7f800000;
                        auVar133 = vblendmps_avx512vl(auVar179,auVar159._0_32_);
                        auVar157._0_4_ =
                             (uint)(bVar93 & 1) * auVar133._0_4_ |
                             (uint)!(bool)(bVar93 & 1) * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 1 & 1);
                        auVar157._4_4_ = (uint)bVar12 * auVar133._4_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 2 & 1);
                        auVar157._8_4_ = (uint)bVar12 * auVar133._8_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 3 & 1);
                        auVar157._12_4_ =
                             (uint)bVar12 * auVar133._12_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 4 & 1);
                        auVar157._16_4_ =
                             (uint)bVar12 * auVar133._16_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 5 & 1);
                        auVar157._20_4_ =
                             (uint)bVar12 * auVar133._20_4_ | (uint)!bVar12 * 0x7f800000;
                        bVar12 = (bool)(bVar93 >> 6 & 1);
                        auVar157._24_4_ =
                             (uint)bVar12 * auVar133._24_4_ | (uint)!bVar12 * 0x7f800000;
                        auVar157._28_4_ =
                             (uint)(bVar93 >> 7) * auVar133._28_4_ |
                             (uint)!(bool)(bVar93 >> 7) * 0x7f800000;
                        auVar133 = vshufps_avx(auVar157,auVar157,0xb1);
                        auVar133 = vminps_avx(auVar157,auVar133);
                        auVar134 = vshufpd_avx(auVar133,auVar133,5);
                        auVar133 = vminps_avx(auVar133,auVar134);
                        auVar134 = vpermpd_avx2(auVar133,0x4e);
                        auVar133 = vminps_avx(auVar133,auVar134);
                        uVar185 = vcmpps_avx512vl(auVar157,auVar133,0);
                        bVar85 = (byte)uVar185 & bVar93;
                        if (bVar85 != 0) {
                          bVar93 = bVar85;
                        }
                        uVar86 = 0;
                        for (uVar87 = (uint)bVar93; (uVar87 & 1) == 0;
                            uVar87 = uVar87 >> 1 | 0x80000000) {
                          uVar86 = uVar86 + 1;
                        }
                        uVar88 = (ulong)uVar86;
                      } while( true );
                    }
                    fVar190 = local_520[uVar88];
                    uVar183 = *(undefined4 *)(local_500 + uVar88 * 4);
                    fVar227 = 1.0 - fVar190;
                    auVar33._8_4_ = 0x80000000;
                    auVar33._0_8_ = 0x8000000080000000;
                    auVar33._12_4_ = 0x80000000;
                    auVar112 = vxorps_avx512vl(ZEXT416((uint)fVar227),auVar33);
                    auVar110 = ZEXT416((uint)(fVar190 * fVar227 * 4.0));
                    auVar113 = vfnmsub213ss_fma(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),
                                                auVar110);
                    auVar110 = vfmadd213ss_fma(ZEXT416((uint)fVar227),ZEXT416((uint)fVar227),
                                               auVar110);
                    fVar227 = fVar227 * auVar112._0_4_ * 0.5;
                    fVar228 = auVar113._0_4_ * 0.5;
                    auVar222 = ZEXT464((uint)fVar228);
                    fVar184 = auVar110._0_4_ * 0.5;
                    fVar189 = fVar190 * fVar190 * 0.5;
                    auVar211._0_4_ = fVar189 * fVar26;
                    auVar211._4_4_ = fVar189 * fVar68;
                    auVar211._8_4_ = fVar189 * fVar69;
                    auVar211._12_4_ = fVar189 * fVar70;
                    auVar194._4_4_ = fVar184;
                    auVar194._0_4_ = fVar184;
                    auVar194._8_4_ = fVar184;
                    auVar194._12_4_ = fVar184;
                    auVar110 = vfmadd132ps_fma(auVar194,auVar211,auVar108);
                    auVar212._4_4_ = fVar228;
                    auVar212._0_4_ = fVar228;
                    auVar212._8_4_ = fVar228;
                    auVar212._12_4_ = fVar228;
                    auVar110 = vfmadd132ps_fma(auVar212,auVar110,auVar27);
                    auVar219 = ZEXT1664(auVar110);
                    auVar195._4_4_ = fVar227;
                    auVar195._0_4_ = fVar227;
                    auVar195._8_4_ = fVar227;
                    auVar195._12_4_ = fVar227;
                    auVar110 = vfmadd132ps_fma(auVar195,auVar110,auVar111);
                    *(undefined4 *)(ray + k * 4 + 0x200) = *(undefined4 *)(local_4e0 + uVar88 * 4);
                    *(int *)(ray + k * 4 + 0x300) = auVar110._0_4_;
                    uVar8 = vextractps_avx(auVar110,1);
                    *(undefined4 *)(ray + k * 4 + 0x340) = uVar8;
                    uVar8 = vextractps_avx(auVar110,2);
                    *(undefined4 *)(ray + k * 4 + 0x380) = uVar8;
                    *(float *)(ray + k * 4 + 0x3c0) = fVar190;
                    *(undefined4 *)(ray + k * 4 + 0x400) = uVar183;
                    *(int *)(ray + k * 4 + 0x440) = (int)local_7d8;
                    *(uint *)(ray + k * 4 + 0x480) = uVar6;
                    *(uint *)(ray + k * 4 + 0x4c0) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x500) = context->user->instPrimID[0];
                  }
                }
              }
            }
          }
        }
        goto LAB_018edd3b;
      }
    }
    uVar183 = *(undefined4 *)(ray + k * 4 + 0x200);
    auVar32._4_4_ = uVar183;
    auVar32._0_4_ = uVar183;
    auVar32._8_4_ = uVar183;
    auVar32._12_4_ = uVar183;
    uVar185 = vcmpps_avx512vl(local_4b0,auVar32,2);
    local_7c8 = (ulong)((uint)local_7c8 & (uint)local_7c8 + 0xf & (uint)uVar185);
  } while( true );
LAB_018ee0f3:
  auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar243 = ZEXT1664(auVar110);
  auVar182 = ZEXT464(0xbf800000);
LAB_018edd3b:
  lVar89 = lVar89 + 8;
  goto LAB_018ed44e;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }